

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack4.h
# Opt level: O0

void ncnn::convolution_winograd_dot_pack4_sse
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  long *in_RCX;
  long *in_RDX;
  int in_ESI;
  void **in_RDI;
  __m128 _val0_4;
  __m128 _w0_4;
  int j_4;
  __m128 _sum;
  int nn_4;
  float *k0_4;
  float *r0_9;
  __m128 _val1_3;
  __m128 _val0_3;
  __m128 _w0_3;
  int j_3;
  __m128 _sum1_3;
  __m128 _sum0_3;
  int nn_3;
  float *k0_3;
  float *r0_8;
  __m128 _val3_2;
  __m128 _val2_2;
  __m128 _val1_2;
  __m128 _val0_2;
  __m128 _w0_2;
  int j_2;
  __m128 _sum3_2;
  __m128 _sum2_2;
  __m128 _sum1_2;
  __m128 _sum0_2;
  int nn_2;
  float *k0_2;
  float *r0_7;
  __m128 _val7_1;
  __m128 _val6_1;
  __m128 _val5_1;
  __m128 _val4_1;
  __m128 _val3_1;
  __m128 _val2_1;
  __m128 _val1_1;
  __m128 _val0_1;
  __m128 _w0_1;
  int j_1;
  __m128 _sum7_1;
  __m128 _sum6_1;
  __m128 _sum5_1;
  __m128 _sum4_1;
  __m128 _sum3_1;
  __m128 _sum2_1;
  __m128 _sum1_1;
  __m128 _sum0_1;
  int nn_1;
  float *k0_1;
  float *r0_6;
  __m128 _valb;
  __m128 _vala;
  __m128 _val9;
  __m128 _val8;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  __m128 _w0;
  int j;
  __m128 _sumb;
  __m128 _suma;
  __m128 _sum9;
  __m128 _sum8;
  __m128 _sum7;
  __m128 _sum6;
  __m128 _sum5;
  __m128 _sum4;
  __m128 _sum3;
  __m128 _sum2;
  __m128 _sum1;
  __m128 _sum0;
  int nn;
  float *k0;
  float *r0_5;
  int i_1;
  Mat bb2;
  int r_1;
  Mat kernel0_tm;
  float *output0_tm;
  int p;
  __m128 _val;
  int q_4;
  float *r0_4;
  float *tmpptr_4;
  __m128 _r01_1;
  __m128 _r01_0;
  __m128 _r1_3;
  __m128 _r0_3;
  int q_3;
  float *r0_3;
  float *tmpptr_3;
  __m128 tmp0_5;
  __m128 tmp1_5;
  __m128 tmp2_5;
  __m128 tmp3_5;
  __m128 _r3_2;
  __m128 _r2_2;
  __m128 _r1_2;
  __m128 _r0_2;
  int q_2;
  float *r0_2;
  float *tmpptr_2;
  __m128 tmp0_4;
  __m128 tmp1_4;
  __m128 tmp2_4;
  __m128 tmp3_4;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 _r7_1;
  __m128 _r6_1;
  __m128 _r5_1;
  __m128 _r4_1;
  __m128 _r3_1;
  __m128 _r2_1;
  __m128 _r1_1;
  __m128 _r0_1;
  int q_1;
  float *r0_1;
  float *tmpptr_1;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _rb;
  __m128 _ra;
  __m128 _r9;
  __m128 _r8;
  __m128 _r7;
  __m128 _r6;
  __m128 _r5;
  __m128 _r4;
  __m128 _r3;
  __m128 _r2;
  __m128 _r1;
  __m128 _r0;
  int q;
  float *r0;
  float *tmpptr;
  int i;
  Mat tm2;
  int r;
  Mat bottom_blob_tm2;
  int inch;
  int batch;
  int tiles;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  undefined8 in_stack_ffffffffffffcc80;
  int _elempack;
  size_t in_stack_ffffffffffffcc88;
  undefined8 in_stack_ffffffffffffcc90;
  int _c;
  int in_stack_ffffffffffffcc98;
  int in_stack_ffffffffffffcc9c;
  undefined4 in_stack_ffffffffffffcca0;
  undefined4 in_stack_ffffffffffffcca4;
  Allocator *in_stack_ffffffffffffcd00;
  int local_2e4c;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 *local_2e28;
  float *local_2e20;
  int local_2ddc;
  undefined8 local_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  undefined8 *local_2da8;
  float *local_2da0;
  int local_2d3c;
  undefined8 local_2d38;
  undefined8 uStack_2d30;
  undefined8 local_2d28;
  undefined8 uStack_2d20;
  undefined8 local_2d18;
  undefined8 uStack_2d10;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 *local_2ce8;
  float *local_2ce0;
  int local_2c3c;
  undefined8 local_2c38;
  undefined8 uStack_2c30;
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  undefined8 local_2bf8;
  undefined8 uStack_2bf0;
  undefined8 local_2be8;
  undefined8 uStack_2be0;
  undefined8 local_2bd8;
  undefined8 uStack_2bd0;
  undefined8 local_2bc8;
  undefined8 uStack_2bc0;
  undefined8 *local_2ba8;
  float *local_2ba0;
  int local_2abc;
  undefined8 local_2ab8;
  undefined8 uStack_2ab0;
  undefined8 local_2aa8;
  undefined8 uStack_2aa0;
  undefined8 local_2a98;
  undefined8 uStack_2a90;
  undefined8 local_2a88;
  undefined8 uStack_2a80;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  undefined8 local_2a68;
  undefined8 uStack_2a60;
  undefined8 local_2a58;
  undefined8 uStack_2a50;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  undefined8 local_2a38;
  undefined8 uStack_2a30;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 *local_29e8;
  float *local_29e0;
  int local_29d4;
  undefined8 local_29d0;
  undefined8 local_29c8;
  undefined8 local_29c0;
  undefined4 local_29b8;
  long *local_29b0;
  undefined4 local_29a8;
  undefined4 local_29a4;
  undefined4 local_29a0;
  undefined4 local_299c;
  undefined4 local_2998;
  undefined8 local_2990;
  int local_2984;
  undefined8 local_2980;
  undefined8 local_2978;
  undefined8 local_2970;
  undefined4 local_2968;
  long local_2960;
  undefined4 local_2958;
  undefined4 local_2954;
  undefined4 local_2950;
  undefined4 local_294c;
  undefined4 local_2948;
  undefined8 local_2940;
  undefined8 local_2938;
  undefined8 local_2930;
  undefined8 local_2928;
  undefined4 local_2920;
  long local_2918;
  undefined4 local_2910;
  undefined4 local_290c;
  undefined4 local_2908;
  undefined4 local_2904;
  undefined4 local_2900;
  undefined8 local_28f8;
  float *local_28f0;
  int local_28e4;
  void *local_28e0;
  int *local_28d8;
  undefined8 local_28d0;
  undefined4 local_28c8;
  long *local_28c0;
  undefined4 local_28b8;
  undefined4 local_28b4;
  undefined4 local_28b0;
  undefined4 local_28ac;
  undefined4 local_28a8;
  undefined8 local_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  int local_287c;
  undefined8 *local_2878;
  undefined8 *local_2870;
  undefined4 local_2868;
  undefined4 uStack_2864;
  undefined4 uStack_2860;
  undefined4 uStack_285c;
  undefined4 local_2858;
  undefined4 uStack_2854;
  undefined4 uStack_2850;
  undefined4 uStack_284c;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  int local_281c;
  undefined8 *local_2818;
  undefined8 *local_2810;
  undefined4 local_2808;
  undefined4 uStack_2804;
  undefined4 uStack_2800;
  undefined4 uStack_27fc;
  undefined4 local_27f8;
  undefined4 uStack_27f4;
  undefined4 uStack_27f0;
  undefined4 uStack_27ec;
  undefined4 local_27e8;
  undefined4 uStack_27e4;
  undefined4 uStack_27e0;
  undefined4 uStack_27dc;
  undefined4 local_27d8;
  undefined4 uStack_27d4;
  undefined4 uStack_27d0;
  undefined4 uStack_27cc;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  undefined8 local_2798;
  undefined8 uStack_2790;
  int local_277c;
  undefined8 *local_2778;
  undefined8 *local_2770;
  undefined4 local_2768;
  undefined4 uStack_2764;
  undefined4 uStack_2760;
  undefined4 uStack_275c;
  undefined4 local_2758;
  undefined4 uStack_2754;
  undefined4 uStack_2750;
  undefined4 uStack_274c;
  undefined4 local_2748;
  undefined4 uStack_2744;
  undefined4 uStack_2740;
  undefined4 uStack_273c;
  undefined4 local_2738;
  undefined4 uStack_2734;
  undefined4 uStack_2730;
  undefined4 uStack_272c;
  undefined4 local_2728;
  undefined4 uStack_2724;
  undefined4 uStack_2720;
  undefined4 uStack_271c;
  undefined4 local_2718;
  undefined4 uStack_2714;
  undefined4 uStack_2710;
  undefined4 uStack_270c;
  undefined4 local_2708;
  undefined4 uStack_2704;
  undefined4 uStack_2700;
  undefined4 uStack_26fc;
  undefined4 local_26f8;
  undefined4 uStack_26f4;
  undefined4 uStack_26f0;
  undefined4 uStack_26ec;
  undefined8 local_26e8;
  undefined8 uStack_26e0;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  undefined8 local_26b8;
  undefined8 uStack_26b0;
  undefined8 local_26a8;
  undefined8 uStack_26a0;
  undefined8 local_2698;
  undefined8 uStack_2690;
  undefined8 local_2688;
  undefined8 uStack_2680;
  undefined8 local_2678;
  undefined8 uStack_2670;
  int local_265c;
  undefined8 *local_2658;
  undefined8 *local_2650;
  undefined4 local_2648;
  undefined4 uStack_2644;
  undefined4 uStack_2640;
  undefined4 uStack_263c;
  undefined4 local_2638;
  undefined4 uStack_2634;
  undefined4 uStack_2630;
  undefined4 uStack_262c;
  undefined4 local_2628;
  undefined4 uStack_2624;
  undefined4 uStack_2620;
  undefined4 uStack_261c;
  undefined4 local_2618;
  undefined4 uStack_2614;
  undefined4 uStack_2610;
  undefined4 uStack_260c;
  undefined4 local_2608;
  undefined4 uStack_2604;
  undefined4 uStack_2600;
  undefined4 uStack_25fc;
  undefined4 local_25f8;
  undefined4 uStack_25f4;
  undefined4 uStack_25f0;
  undefined4 uStack_25ec;
  undefined4 local_25e8;
  undefined4 uStack_25e4;
  undefined4 uStack_25e0;
  undefined4 uStack_25dc;
  undefined4 local_25d8;
  undefined4 uStack_25d4;
  undefined4 uStack_25d0;
  undefined4 uStack_25cc;
  undefined4 local_25c8;
  undefined4 uStack_25c4;
  undefined4 uStack_25c0;
  undefined4 uStack_25bc;
  undefined4 local_25b8;
  undefined4 uStack_25b4;
  undefined4 uStack_25b0;
  undefined4 uStack_25ac;
  undefined4 local_25a8;
  undefined4 uStack_25a4;
  undefined4 uStack_25a0;
  undefined4 uStack_259c;
  undefined4 local_2598;
  undefined4 uStack_2594;
  undefined4 uStack_2590;
  undefined4 uStack_258c;
  undefined8 local_2588;
  undefined8 uStack_2580;
  undefined8 local_2578;
  undefined8 uStack_2570;
  undefined8 local_2568;
  undefined8 uStack_2560;
  undefined8 local_2558;
  undefined8 uStack_2550;
  undefined8 local_2548;
  undefined8 uStack_2540;
  undefined8 local_2538;
  undefined8 uStack_2530;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  undefined8 uStack_2500;
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  int local_24c4;
  undefined8 *local_24c0;
  undefined8 *local_24b8;
  int local_24ac;
  undefined8 local_24a8;
  undefined8 local_24a0;
  undefined8 local_2498;
  undefined4 local_2490;
  long *local_2488;
  undefined4 local_2480;
  undefined4 local_247c;
  undefined4 local_2478;
  undefined4 local_2474;
  undefined4 local_2470;
  undefined8 local_2468;
  int local_2460;
  void *local_2450;
  int *local_2448;
  long local_2440;
  undefined4 local_2438;
  long *local_2430;
  undefined4 local_2428;
  int local_2424;
  int local_2420;
  undefined4 local_241c;
  undefined4 local_2418;
  long local_2410;
  int local_2404;
  int local_2400;
  int local_23fc;
  long *local_23f0;
  long *local_23e8;
  int local_23dc;
  void **local_23d8;
  void **local_23d0;
  void **local_23c8;
  undefined8 *local_23c0;
  void **local_23b0;
  undefined8 *local_23a0;
  undefined8 *local_2390;
  undefined8 *local_2380;
  void **local_2370;
  void **local_2358;
  void **local_2350;
  int local_2340;
  undefined4 local_233c;
  void **local_2338;
  int local_2320;
  undefined4 local_231c;
  void **local_2318;
  undefined8 *local_22f8;
  undefined8 *local_22d8;
  undefined8 *local_22b8;
  int local_22a0;
  undefined4 local_229c;
  void **local_2298;
  undefined8 *local_2278;
  undefined1 local_226d;
  int local_226c;
  void **local_2268;
  undefined8 *local_2260;
  undefined1 local_223d;
  int local_223c;
  undefined8 *local_2230;
  undefined1 local_220d;
  int local_220c;
  void **local_2208;
  undefined8 *local_2200;
  undefined8 *local_21e0;
  int local_21d4;
  undefined8 *local_21d0;
  int local_21c4;
  undefined8 *local_21c0;
  int local_21b4;
  undefined8 *local_21b0;
  int local_21a4;
  undefined8 *local_21a0;
  int local_2194;
  undefined8 *local_2190;
  int local_2184;
  undefined8 *local_2180;
  int local_2174;
  undefined8 *local_2170;
  int local_2164;
  undefined8 *local_2160;
  int local_2154;
  undefined8 *local_2150;
  int local_2144;
  undefined8 *local_2140;
  undefined1 local_2135;
  int local_2134;
  undefined8 *local_2128;
  void **local_2108;
  void **local_2100;
  void **local_20f8;
  void **local_20f0;
  void **local_20e8;
  void *local_20b0;
  void *local_2070;
  void *local_2060;
  int local_2054;
  undefined8 *local_2050;
  int local_2044;
  undefined8 *local_2040;
  int local_2034;
  undefined8 *local_2030;
  int local_2024;
  undefined8 *local_2020;
  int local_2014;
  undefined8 *local_2010;
  undefined8 *local_2008;
  undefined8 *local_2000;
  undefined8 *local_1ff8;
  undefined8 *local_1ff0;
  undefined8 *local_1fe8;
  undefined8 *local_1fe0;
  undefined8 *local_1fd8;
  undefined8 *local_1fd0;
  undefined8 *local_1fc8;
  undefined8 *local_1fc0;
  undefined8 *local_1fb8;
  undefined8 *local_1fb0;
  undefined8 *local_1fa8;
  undefined8 *local_1fa0;
  undefined8 *local_1f98;
  undefined8 *local_1f90;
  undefined8 *local_1f88;
  undefined8 *local_1f80;
  undefined8 *local_1f78;
  undefined8 *local_1f70;
  undefined8 *local_1f68;
  undefined8 *local_1f60;
  undefined8 *local_1f58;
  undefined8 *local_1f50;
  undefined8 *local_1f48;
  undefined8 *local_1f40;
  undefined8 *local_1f38;
  undefined8 *local_1f30;
  undefined8 *local_1f28;
  undefined8 *local_1f20;
  undefined8 *local_1f18;
  undefined8 *local_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  float *local_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  float *local_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  float *local_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  float *local_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  float *local_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  float *local_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  float *local_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  float *local_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  float *local_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  float *local_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  float *local_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  float *local_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  float *local_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  float *local_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  float *local_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  float *local_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  float *local_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  float *local_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  float *local_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  float *local_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  float *local_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  float *local_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  float *local_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  float *local_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  float *local_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  float *local_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  float *local_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 *local_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 *local_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 *local_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 *local_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 *local_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 *local_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 *local_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 *local_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 *local_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 *local_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 *local_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 *local_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 *local_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 *local_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 *local_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 *local_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 *local_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 *local_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 *local_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 *local_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 *local_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 *local_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 *local_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 *local_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 *local_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 *local_1210;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float *pfStack_11f0;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float *pfStack_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b4;
  float *local_11b0;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float *pfStack_1190;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1174;
  float *local_1170;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1154;
  float *local_1150;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1134;
  float *local_1130;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float *pfStack_1110;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f4;
  float *local_10f0;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d4;
  float *local_10d0;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b4;
  float *local_10b0;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1094;
  float *local_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1074;
  float *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1054;
  float *local_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1034;
  float *local_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float *pfStack_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff4;
  float *local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd4;
  float *local_fd0;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb4;
  float *local_fb0;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f94;
  float *local_f90;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  float local_f74;
  float *local_f70;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  float local_f54;
  float *local_f50;
  float local_f48;
  float fStack_f44;
  float fStack_f40;
  float fStack_f3c;
  float local_f34;
  float *local_f30;
  float local_f28;
  float fStack_f24;
  float fStack_f20;
  float fStack_f1c;
  float local_f14;
  float *local_f10;
  float local_f08;
  float fStack_f04;
  float fStack_f00;
  float fStack_efc;
  float local_ef4;
  float *local_ef0;
  float local_ee8;
  float fStack_ee4;
  float fStack_ee0;
  float fStack_edc;
  float local_ed4;
  float *local_ed0;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  float local_eb4;
  float *local_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined8 local_918;
  undefined8 uStack_910;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined8 local_858;
  undefined8 uStack_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined8 local_838;
  undefined8 uStack_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  undefined8 local_798;
  undefined8 uStack_790;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined8 local_698;
  undefined8 uStack_690;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long *local_e8;
  undefined4 local_dc;
  long local_d8;
  void *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  float *local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long *local_78;
  undefined4 local_6c;
  long local_68;
  void *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_ffffffffffffcc90 >> 0x20);
  local_23fc = *(int *)((long)in_RDI + 0x2c);
  local_2400 = *(int *)(in_RDI + 6);
  local_2404 = *(int *)(in_RDI + 7);
  local_23d0 = &local_2450;
  local_2450 = (void *)0x0;
  local_2448 = (int *)0x0;
  local_2440 = 0;
  local_2438 = 0;
  local_2430 = (long *)0x0;
  local_2428 = 0;
  local_2424 = 0;
  local_2420 = 0;
  local_241c = 0;
  local_2418 = 0;
  local_2410 = 0;
  _elempack = (int)((ulong)in_stack_ffffffffffffcc80 >> 0x20);
  local_23f0 = in_RCX;
  local_23e8 = in_RDX;
  local_23dc = in_ESI;
  local_23d8 = in_RDI;
  if (local_23fc < 0xc) {
    if (local_23fc < 8) {
      if (local_23fc < 4) {
        if (local_23fc < 2) {
          Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcca4,in_stack_ffffffffffffcca0),
                      in_stack_ffffffffffffcc9c,in_stack_ffffffffffffcc98,_c,
                      in_stack_ffffffffffffcc88,_elempack,in_stack_ffffffffffffcd00);
        }
        else {
          Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcca4,in_stack_ffffffffffffcca0),
                      in_stack_ffffffffffffcc9c,in_stack_ffffffffffffcc98,_c,
                      in_stack_ffffffffffffcc88,_elempack,in_stack_ffffffffffffcd00);
        }
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcca4,in_stack_ffffffffffffcca0),
                    in_stack_ffffffffffffcc9c,in_stack_ffffffffffffcc98,_c,in_stack_ffffffffffffcc88
                    ,_elempack,in_stack_ffffffffffffcd00);
      }
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcca4,in_stack_ffffffffffffcca0),
                  in_stack_ffffffffffffcc9c,in_stack_ffffffffffffcc98,_c,in_stack_ffffffffffffcc88,
                  _elempack,in_stack_ffffffffffffcd00);
    }
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcca4,in_stack_ffffffffffffcca0),
                in_stack_ffffffffffffcc9c,in_stack_ffffffffffffcc98,_c,in_stack_ffffffffffffcc88,
                _elempack,in_stack_ffffffffffffcd00);
  }
  for (local_2460 = 0; local_2460 < local_2400; local_2460 = local_2460 + 1) {
    local_2200 = &local_24a8;
    local_2208 = &local_2450;
    local_d0 = (void *)((long)local_2450 + local_2410 * local_2460 * local_2440);
    local_b8 = &local_24a8;
    local_2488 = local_2430;
    local_18 = (long)local_2424 * (long)local_2420 * local_2440;
    local_1c = 0x10;
    local_bc = local_2424;
    local_c0 = local_2420;
    local_c4 = local_241c;
    local_d8 = local_2440;
    local_dc = local_2438;
    local_e8 = local_2430;
    local_220c = local_2460;
    local_220d = 1;
    for (local_24ac = 0; local_24ac + 0xb < local_23fc; local_24ac = local_24ac + 0xc) {
      local_2014 = local_24ac / 0xc;
      local_2010 = &local_24a8;
      local_24b8 = (undefined8 *)((long)local_d0 + (long)local_2424 * (long)local_2014 * local_2440)
      ;
      local_20e8 = local_23d8;
      local_24c0 = (undefined8 *)
                   ((long)*local_23d8 + (long)((local_2460 * local_23fc + local_24ac) * 4) * 4);
      for (local_24c4 = 0; local_24c4 < local_2404; local_24c4 = local_24c4 + 1) {
        local_1f10 = local_24c0;
        local_1bd8 = *local_24c0;
        uStack_1d70 = local_24c0[1];
        local_1f18 = local_24c0 + 2;
        local_1be8 = *local_1f18;
        uStack_1d80 = local_24c0[3];
        local_1f20 = local_24c0 + 4;
        local_1bf8 = *local_1f20;
        uStack_1d90 = local_24c0[5];
        local_1f28 = local_24c0 + 6;
        local_1c08 = *local_1f28;
        uStack_1da0 = local_24c0[7];
        local_1f30 = local_24c0 + 8;
        local_1c18 = *local_1f30;
        uStack_1db0 = local_24c0[9];
        local_1f38 = local_24c0 + 10;
        local_1c28 = *local_1f38;
        uStack_1dc0 = local_24c0[0xb];
        local_1f40 = local_24c0 + 0xc;
        local_1c38 = *local_1f40;
        uStack_1dd0 = local_24c0[0xd];
        local_1f48 = local_24c0 + 0xe;
        local_1c48 = *local_1f48;
        uStack_1de0 = local_24c0[0xf];
        local_1f50 = local_24c0 + 0x10;
        local_1c58 = *local_1f50;
        uStack_1df0 = local_24c0[0x11];
        local_1f58 = local_24c0 + 0x12;
        local_1c68 = *local_1f58;
        uStack_1e00 = local_24c0[0x13];
        local_1f60 = local_24c0 + 0x14;
        local_1c78 = *local_1f60;
        uStack_1e10 = local_24c0[0x15];
        local_1f68 = local_24c0 + 0x16;
        local_1c88 = *local_1f68;
        uStack_1e20 = local_24c0[0x17];
        local_1d78._0_4_ = (undefined4)local_1bd8;
        local_25c8 = (undefined4)local_1d78;
        local_1d78._4_4_ = (undefined4)((ulong)local_1bd8 >> 0x20);
        uStack_25c0 = local_1d78._4_4_;
        local_1d88._0_4_ = (undefined4)local_1be8;
        uStack_25c4 = (undefined4)local_1d88;
        local_1d88._4_4_ = (undefined4)((ulong)local_1be8 >> 0x20);
        uStack_25bc = local_1d88._4_4_;
        local_1d98._0_4_ = (undefined4)local_1bf8;
        local_25a8 = (undefined4)local_1d98;
        local_1d98._4_4_ = (undefined4)((ulong)local_1bf8 >> 0x20);
        uStack_25a0 = local_1d98._4_4_;
        local_1da8._0_4_ = (undefined4)local_1c08;
        uStack_25a4 = (undefined4)local_1da8;
        local_1da8._4_4_ = (undefined4)((ulong)local_1c08 >> 0x20);
        uStack_259c = local_1da8._4_4_;
        uStack_1bd0._0_4_ = (undefined4)uStack_1d70;
        local_25b8 = (undefined4)uStack_1bd0;
        uStack_1bd0._4_4_ = (undefined4)((ulong)uStack_1d70 >> 0x20);
        uStack_25b0 = uStack_1bd0._4_4_;
        uStack_1be0._0_4_ = (undefined4)uStack_1d80;
        uStack_25b4 = (undefined4)uStack_1be0;
        uStack_1be0._4_4_ = (undefined4)((ulong)uStack_1d80 >> 0x20);
        uStack_25ac = uStack_1be0._4_4_;
        uStack_1bf0._0_4_ = (undefined4)uStack_1d90;
        local_2598 = (undefined4)uStack_1bf0;
        uStack_1bf0._4_4_ = (undefined4)((ulong)uStack_1d90 >> 0x20);
        uStack_2590 = uStack_1bf0._4_4_;
        uStack_1c00._0_4_ = (undefined4)uStack_1da0;
        uStack_2594 = (undefined4)uStack_1c00;
        uStack_1c00._4_4_ = (undefined4)((ulong)uStack_1da0 >> 0x20);
        uStack_258c = uStack_1c00._4_4_;
        local_1a58 = CONCAT44((undefined4)local_1d88,(undefined4)local_1d78);
        uStack_1a50 = CONCAT44(local_1d88._4_4_,local_1d78._4_4_);
        local_1a68 = CONCAT44((undefined4)local_1da8,(undefined4)local_1d98);
        uStack_1a60 = CONCAT44(local_1da8._4_4_,local_1d98._4_4_);
        local_24d8 = CONCAT44((undefined4)local_1d88,(undefined4)local_1d78);
        uStack_24d0 = CONCAT44((undefined4)local_1da8,(undefined4)local_1d98);
        local_18d8 = CONCAT44((undefined4)local_1da8,(undefined4)local_1d98);
        uStack_18d0 = CONCAT44(local_1da8._4_4_,local_1d98._4_4_);
        local_18e8 = CONCAT44((undefined4)local_1d88,(undefined4)local_1d78);
        uStack_18e0 = CONCAT44(local_1d88._4_4_,local_1d78._4_4_);
        local_24e8 = CONCAT44(local_1d88._4_4_,local_1d78._4_4_);
        uStack_24e0 = CONCAT44(local_1da8._4_4_,local_1d98._4_4_);
        local_1a78 = CONCAT44((undefined4)uStack_1be0,(undefined4)uStack_1bd0);
        uStack_1a70 = CONCAT44(uStack_1be0._4_4_,uStack_1bd0._4_4_);
        local_1a88 = CONCAT44((undefined4)uStack_1c00,(undefined4)uStack_1bf0);
        uStack_1a80 = CONCAT44(uStack_1c00._4_4_,uStack_1bf0._4_4_);
        local_24f8 = CONCAT44((undefined4)uStack_1be0,(undefined4)uStack_1bd0);
        uStack_24f0 = CONCAT44((undefined4)uStack_1c00,(undefined4)uStack_1bf0);
        local_18f8 = CONCAT44((undefined4)uStack_1c00,(undefined4)uStack_1bf0);
        uStack_18f0 = CONCAT44(uStack_1c00._4_4_,uStack_1bf0._4_4_);
        local_1908 = CONCAT44((undefined4)uStack_1be0,(undefined4)uStack_1bd0);
        uStack_1900 = CONCAT44(uStack_1be0._4_4_,uStack_1bd0._4_4_);
        local_2508 = CONCAT44(uStack_1be0._4_4_,uStack_1bd0._4_4_);
        uStack_2500 = CONCAT44(uStack_1c00._4_4_,uStack_1bf0._4_4_);
        local_1db8._0_4_ = (undefined4)local_1c18;
        local_2608 = (undefined4)local_1db8;
        local_1db8._4_4_ = (undefined4)((ulong)local_1c18 >> 0x20);
        uStack_2600 = local_1db8._4_4_;
        local_1dc8._0_4_ = (undefined4)local_1c28;
        uStack_2604 = (undefined4)local_1dc8;
        local_1dc8._4_4_ = (undefined4)((ulong)local_1c28 >> 0x20);
        uStack_25fc = local_1dc8._4_4_;
        local_1dd8._0_4_ = (undefined4)local_1c38;
        local_25e8 = (undefined4)local_1dd8;
        local_1dd8._4_4_ = (undefined4)((ulong)local_1c38 >> 0x20);
        uStack_25e0 = local_1dd8._4_4_;
        local_1de8._0_4_ = (undefined4)local_1c48;
        uStack_25e4 = (undefined4)local_1de8;
        local_1de8._4_4_ = (undefined4)((ulong)local_1c48 >> 0x20);
        uStack_25dc = local_1de8._4_4_;
        uStack_1c10._0_4_ = (undefined4)uStack_1db0;
        local_25f8 = (undefined4)uStack_1c10;
        uStack_1c10._4_4_ = (undefined4)((ulong)uStack_1db0 >> 0x20);
        uStack_25f0 = uStack_1c10._4_4_;
        uStack_1c20._0_4_ = (undefined4)uStack_1dc0;
        uStack_25f4 = (undefined4)uStack_1c20;
        uStack_1c20._4_4_ = (undefined4)((ulong)uStack_1dc0 >> 0x20);
        uStack_25ec = uStack_1c20._4_4_;
        uStack_1c30._0_4_ = (undefined4)uStack_1dd0;
        local_25d8 = (undefined4)uStack_1c30;
        uStack_1c30._4_4_ = (undefined4)((ulong)uStack_1dd0 >> 0x20);
        uStack_25d0 = uStack_1c30._4_4_;
        uStack_1c40._0_4_ = (undefined4)uStack_1de0;
        uStack_25d4 = (undefined4)uStack_1c40;
        uStack_1c40._4_4_ = (undefined4)((ulong)uStack_1de0 >> 0x20);
        uStack_25cc = uStack_1c40._4_4_;
        local_1a98 = CONCAT44((undefined4)local_1dc8,(undefined4)local_1db8);
        uStack_1a90 = CONCAT44(local_1dc8._4_4_,local_1db8._4_4_);
        local_1aa8 = CONCAT44((undefined4)local_1de8,(undefined4)local_1dd8);
        uStack_1aa0 = CONCAT44(local_1de8._4_4_,local_1dd8._4_4_);
        local_2518 = CONCAT44((undefined4)local_1dc8,(undefined4)local_1db8);
        uStack_2510 = CONCAT44((undefined4)local_1de8,(undefined4)local_1dd8);
        local_1918 = CONCAT44((undefined4)local_1de8,(undefined4)local_1dd8);
        uStack_1910 = CONCAT44(local_1de8._4_4_,local_1dd8._4_4_);
        local_1928 = CONCAT44((undefined4)local_1dc8,(undefined4)local_1db8);
        uStack_1920 = CONCAT44(local_1dc8._4_4_,local_1db8._4_4_);
        local_2528 = CONCAT44(local_1dc8._4_4_,local_1db8._4_4_);
        uStack_2520 = CONCAT44(local_1de8._4_4_,local_1dd8._4_4_);
        local_1ab8 = CONCAT44((undefined4)uStack_1c20,(undefined4)uStack_1c10);
        uStack_1ab0 = CONCAT44(uStack_1c20._4_4_,uStack_1c10._4_4_);
        local_1ac8 = CONCAT44((undefined4)uStack_1c40,(undefined4)uStack_1c30);
        uStack_1ac0 = CONCAT44(uStack_1c40._4_4_,uStack_1c30._4_4_);
        local_2538 = CONCAT44((undefined4)uStack_1c20,(undefined4)uStack_1c10);
        uStack_2530 = CONCAT44((undefined4)uStack_1c40,(undefined4)uStack_1c30);
        local_1938 = CONCAT44((undefined4)uStack_1c40,(undefined4)uStack_1c30);
        uStack_1930 = CONCAT44(uStack_1c40._4_4_,uStack_1c30._4_4_);
        local_1948 = CONCAT44((undefined4)uStack_1c20,(undefined4)uStack_1c10);
        uStack_1940 = CONCAT44(uStack_1c20._4_4_,uStack_1c10._4_4_);
        local_2548 = CONCAT44(uStack_1c20._4_4_,uStack_1c10._4_4_);
        uStack_2540 = CONCAT44(uStack_1c40._4_4_,uStack_1c30._4_4_);
        local_1df8._0_4_ = (undefined4)local_1c58;
        local_2648 = (undefined4)local_1df8;
        local_1df8._4_4_ = (undefined4)((ulong)local_1c58 >> 0x20);
        uStack_2640 = local_1df8._4_4_;
        local_1e08._0_4_ = (undefined4)local_1c68;
        uStack_2644 = (undefined4)local_1e08;
        local_1e08._4_4_ = (undefined4)((ulong)local_1c68 >> 0x20);
        uStack_263c = local_1e08._4_4_;
        local_1e18._0_4_ = (undefined4)local_1c78;
        local_2628 = (undefined4)local_1e18;
        local_1e18._4_4_ = (undefined4)((ulong)local_1c78 >> 0x20);
        uStack_2620 = local_1e18._4_4_;
        local_1e28._0_4_ = (undefined4)local_1c88;
        uStack_2624 = (undefined4)local_1e28;
        local_1e28._4_4_ = (undefined4)((ulong)local_1c88 >> 0x20);
        uStack_261c = local_1e28._4_4_;
        uStack_1c50._0_4_ = (undefined4)uStack_1df0;
        local_2638 = (undefined4)uStack_1c50;
        uStack_1c50._4_4_ = (undefined4)((ulong)uStack_1df0 >> 0x20);
        uStack_2630 = uStack_1c50._4_4_;
        uStack_1c60._0_4_ = (undefined4)uStack_1e00;
        uStack_2634 = (undefined4)uStack_1c60;
        uStack_1c60._4_4_ = (undefined4)((ulong)uStack_1e00 >> 0x20);
        uStack_262c = uStack_1c60._4_4_;
        uStack_1c70._0_4_ = (undefined4)uStack_1e10;
        local_2618 = (undefined4)uStack_1c70;
        uStack_1c70._4_4_ = (undefined4)((ulong)uStack_1e10 >> 0x20);
        uStack_2610 = uStack_1c70._4_4_;
        uStack_1c80._0_4_ = (undefined4)uStack_1e20;
        uStack_2614 = (undefined4)uStack_1c80;
        uStack_1c80._4_4_ = (undefined4)((ulong)uStack_1e20 >> 0x20);
        uStack_260c = uStack_1c80._4_4_;
        local_1ad8 = CONCAT44((undefined4)local_1e08,(undefined4)local_1df8);
        uStack_1ad0 = CONCAT44(local_1e08._4_4_,local_1df8._4_4_);
        local_1ae8 = CONCAT44((undefined4)local_1e28,(undefined4)local_1e18);
        uStack_1ae0 = CONCAT44(local_1e28._4_4_,local_1e18._4_4_);
        local_2558 = CONCAT44((undefined4)local_1e08,(undefined4)local_1df8);
        uStack_2550 = CONCAT44((undefined4)local_1e28,(undefined4)local_1e18);
        local_1958 = CONCAT44((undefined4)local_1e28,(undefined4)local_1e18);
        uStack_1950 = CONCAT44(local_1e28._4_4_,local_1e18._4_4_);
        local_1968 = CONCAT44((undefined4)local_1e08,(undefined4)local_1df8);
        uStack_1960 = CONCAT44(local_1e08._4_4_,local_1df8._4_4_);
        local_2568 = CONCAT44(local_1e08._4_4_,local_1df8._4_4_);
        uStack_2560 = CONCAT44(local_1e28._4_4_,local_1e18._4_4_);
        local_1af8 = CONCAT44((undefined4)uStack_1c60,(undefined4)uStack_1c50);
        uStack_1af0 = CONCAT44(uStack_1c60._4_4_,uStack_1c50._4_4_);
        local_1b08 = CONCAT44((undefined4)uStack_1c80,(undefined4)uStack_1c70);
        uStack_1b00 = CONCAT44(uStack_1c80._4_4_,uStack_1c70._4_4_);
        local_2578 = CONCAT44((undefined4)uStack_1c60,(undefined4)uStack_1c50);
        uStack_2570 = CONCAT44((undefined4)uStack_1c80,(undefined4)uStack_1c70);
        local_1978 = CONCAT44((undefined4)uStack_1c80,(undefined4)uStack_1c70);
        uStack_1970 = CONCAT44(uStack_1c80._4_4_,uStack_1c70._4_4_);
        local_1988 = CONCAT44((undefined4)uStack_1c60,(undefined4)uStack_1c50);
        uStack_1980 = CONCAT44(uStack_1c60._4_4_,uStack_1c50._4_4_);
        local_2588 = CONCAT44(uStack_1c60._4_4_,uStack_1c50._4_4_);
        uStack_2580 = CONCAT44(uStack_1c80._4_4_,uStack_1c70._4_4_);
        local_1210 = local_24b8;
        *local_24b8 = local_24d8;
        local_24b8[1] = uStack_24d0;
        local_1230 = local_24b8 + 2;
        *local_1230 = local_2518;
        local_24b8[3] = uStack_2510;
        local_1250 = local_24b8 + 4;
        *local_1250 = local_2558;
        local_24b8[5] = uStack_2550;
        local_1270 = local_24b8 + 6;
        local_1288 = local_24e8;
        uStack_1280 = uStack_24e0;
        *local_1270 = local_24e8;
        local_24b8[7] = uStack_24e0;
        local_1290 = local_24b8 + 8;
        local_12a8 = local_2528;
        uStack_12a0 = uStack_2520;
        *local_1290 = local_2528;
        local_24b8[9] = uStack_2520;
        local_12b0 = local_24b8 + 10;
        local_12c8 = local_2568;
        uStack_12c0 = uStack_2560;
        *local_12b0 = local_2568;
        local_24b8[0xb] = uStack_2560;
        local_12d0 = local_24b8 + 0xc;
        *local_12d0 = local_24f8;
        local_24b8[0xd] = uStack_24f0;
        local_12f0 = local_24b8 + 0xe;
        *local_12f0 = local_2538;
        local_24b8[0xf] = uStack_2530;
        local_1310 = local_24b8 + 0x10;
        *local_1310 = local_2578;
        local_24b8[0x11] = uStack_2570;
        local_1330 = local_24b8 + 0x12;
        local_1348 = local_2508;
        uStack_1340 = uStack_2500;
        *local_1330 = local_2508;
        local_24b8[0x13] = uStack_2500;
        local_1350 = local_24b8 + 0x14;
        local_1368 = local_2548;
        uStack_1360 = uStack_2540;
        *local_1350 = local_2548;
        local_24b8[0x15] = uStack_2540;
        local_1370 = local_24b8 + 0x16;
        local_1388 = local_2588;
        uStack_1380 = uStack_2580;
        *local_1370 = local_2588;
        local_24b8[0x17] = uStack_2580;
        local_24c0 = local_24c0 + (long)local_23d8[8] * 2;
        local_24b8 = local_24b8 + 0x18;
        local_1e28 = local_1c88;
        local_1e18 = local_1c78;
        local_1e08 = local_1c68;
        local_1df8 = local_1c58;
        local_1de8 = local_1c48;
        local_1dd8 = local_1c38;
        local_1dc8 = local_1c28;
        local_1db8 = local_1c18;
        local_1da8 = local_1c08;
        local_1d98 = local_1bf8;
        local_1d88 = local_1be8;
        local_1d78 = local_1bd8;
        uStack_1c80 = uStack_1e20;
        uStack_1c70 = uStack_1e10;
        uStack_1c60 = uStack_1e00;
        uStack_1c50 = uStack_1df0;
        uStack_1c40 = uStack_1de0;
        uStack_1c30 = uStack_1dd0;
        uStack_1c20 = uStack_1dc0;
        uStack_1c10 = uStack_1db0;
        uStack_1c00 = uStack_1da0;
        uStack_1bf0 = uStack_1d90;
        uStack_1be0 = uStack_1d80;
        uStack_1bd0 = uStack_1d70;
        local_1328 = local_2578;
        uStack_1320 = uStack_2570;
        local_1308 = local_2538;
        uStack_1300 = uStack_2530;
        local_12e8 = local_24f8;
        uStack_12e0 = uStack_24f0;
        local_1268 = local_2558;
        uStack_1260 = uStack_2550;
        local_1248 = local_2518;
        uStack_1240 = uStack_2510;
        local_1228 = local_24d8;
        uStack_1220 = uStack_24d0;
      }
    }
    for (; local_24ac + 7 < local_23fc; local_24ac = local_24ac + 8) {
      local_2024 = local_24ac / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                               (long)local_24ac % 0xc & 0xffffffffU) / 8);
      local_2020 = &local_24a8;
      local_2650 = (undefined8 *)((long)local_d0 + (long)local_2424 * (long)local_2024 * local_2440)
      ;
      local_20f0 = local_23d8;
      local_2658 = (undefined8 *)
                   ((long)*local_23d8 + (long)((local_2460 * local_23fc + local_24ac) * 4) * 4);
      for (local_265c = 0; local_265c < local_2404; local_265c = local_265c + 1) {
        local_1f70 = local_2658;
        local_1c98 = *local_2658;
        uStack_1e30 = local_2658[1];
        local_1f78 = local_2658 + 2;
        local_1ca8 = *local_1f78;
        uStack_1e40 = local_2658[3];
        local_1f80 = local_2658 + 4;
        local_1cb8 = *local_1f80;
        uStack_1e50 = local_2658[5];
        local_1f88 = local_2658 + 6;
        local_1cc8 = *local_1f88;
        uStack_1e60 = local_2658[7];
        local_1f90 = local_2658 + 8;
        local_1cd8 = *local_1f90;
        uStack_1e70 = local_2658[9];
        local_1f98 = local_2658 + 10;
        local_1ce8 = *local_1f98;
        uStack_1e80 = local_2658[0xb];
        local_1fa0 = local_2658 + 0xc;
        local_1cf8 = *local_1fa0;
        uStack_1e90 = local_2658[0xd];
        local_1fa8 = local_2658 + 0xe;
        local_1d08 = *local_1fa8;
        uStack_1ea0 = local_2658[0xf];
        local_1e38._0_4_ = (undefined4)local_1c98;
        local_2728 = (undefined4)local_1e38;
        local_1e38._4_4_ = (undefined4)((ulong)local_1c98 >> 0x20);
        uStack_2720 = local_1e38._4_4_;
        local_1e48._0_4_ = (undefined4)local_1ca8;
        uStack_2724 = (undefined4)local_1e48;
        local_1e48._4_4_ = (undefined4)((ulong)local_1ca8 >> 0x20);
        uStack_271c = local_1e48._4_4_;
        local_1e58._0_4_ = (undefined4)local_1cb8;
        local_2708 = (undefined4)local_1e58;
        local_1e58._4_4_ = (undefined4)((ulong)local_1cb8 >> 0x20);
        uStack_2700 = local_1e58._4_4_;
        local_1e68._0_4_ = (undefined4)local_1cc8;
        uStack_2704 = (undefined4)local_1e68;
        local_1e68._4_4_ = (undefined4)((ulong)local_1cc8 >> 0x20);
        uStack_26fc = local_1e68._4_4_;
        uStack_1c90._0_4_ = (undefined4)uStack_1e30;
        local_2718 = (undefined4)uStack_1c90;
        uStack_1c90._4_4_ = (undefined4)((ulong)uStack_1e30 >> 0x20);
        uStack_2710 = uStack_1c90._4_4_;
        uStack_1ca0._0_4_ = (undefined4)uStack_1e40;
        uStack_2714 = (undefined4)uStack_1ca0;
        uStack_1ca0._4_4_ = (undefined4)((ulong)uStack_1e40 >> 0x20);
        uStack_270c = uStack_1ca0._4_4_;
        uStack_1cb0._0_4_ = (undefined4)uStack_1e50;
        local_26f8 = (undefined4)uStack_1cb0;
        uStack_1cb0._4_4_ = (undefined4)((ulong)uStack_1e50 >> 0x20);
        uStack_26f0 = uStack_1cb0._4_4_;
        uStack_1cc0._0_4_ = (undefined4)uStack_1e60;
        uStack_26f4 = (undefined4)uStack_1cc0;
        uStack_1cc0._4_4_ = (undefined4)((ulong)uStack_1e60 >> 0x20);
        uStack_26ec = uStack_1cc0._4_4_;
        local_1b18 = CONCAT44((undefined4)local_1e48,(undefined4)local_1e38);
        uStack_1b10 = CONCAT44(local_1e48._4_4_,local_1e38._4_4_);
        local_1b28 = CONCAT44((undefined4)local_1e68,(undefined4)local_1e58);
        uStack_1b20 = CONCAT44(local_1e68._4_4_,local_1e58._4_4_);
        local_2678 = CONCAT44((undefined4)local_1e48,(undefined4)local_1e38);
        uStack_2670 = CONCAT44((undefined4)local_1e68,(undefined4)local_1e58);
        local_1998 = CONCAT44((undefined4)local_1e68,(undefined4)local_1e58);
        uStack_1990 = CONCAT44(local_1e68._4_4_,local_1e58._4_4_);
        local_19a8 = CONCAT44((undefined4)local_1e48,(undefined4)local_1e38);
        uStack_19a0 = CONCAT44(local_1e48._4_4_,local_1e38._4_4_);
        local_2688 = CONCAT44(local_1e48._4_4_,local_1e38._4_4_);
        uStack_2680 = CONCAT44(local_1e68._4_4_,local_1e58._4_4_);
        local_1b38 = CONCAT44((undefined4)uStack_1ca0,(undefined4)uStack_1c90);
        uStack_1b30 = CONCAT44(uStack_1ca0._4_4_,uStack_1c90._4_4_);
        local_1b48 = CONCAT44((undefined4)uStack_1cc0,(undefined4)uStack_1cb0);
        uStack_1b40 = CONCAT44(uStack_1cc0._4_4_,uStack_1cb0._4_4_);
        local_2698 = CONCAT44((undefined4)uStack_1ca0,(undefined4)uStack_1c90);
        uStack_2690 = CONCAT44((undefined4)uStack_1cc0,(undefined4)uStack_1cb0);
        local_19b8 = CONCAT44((undefined4)uStack_1cc0,(undefined4)uStack_1cb0);
        uStack_19b0 = CONCAT44(uStack_1cc0._4_4_,uStack_1cb0._4_4_);
        local_19c8 = CONCAT44((undefined4)uStack_1ca0,(undefined4)uStack_1c90);
        uStack_19c0 = CONCAT44(uStack_1ca0._4_4_,uStack_1c90._4_4_);
        local_26a8 = CONCAT44(uStack_1ca0._4_4_,uStack_1c90._4_4_);
        uStack_26a0 = CONCAT44(uStack_1cc0._4_4_,uStack_1cb0._4_4_);
        local_1e78._0_4_ = (undefined4)local_1cd8;
        local_2768 = (undefined4)local_1e78;
        local_1e78._4_4_ = (undefined4)((ulong)local_1cd8 >> 0x20);
        uStack_2760 = local_1e78._4_4_;
        local_1e88._0_4_ = (undefined4)local_1ce8;
        uStack_2764 = (undefined4)local_1e88;
        local_1e88._4_4_ = (undefined4)((ulong)local_1ce8 >> 0x20);
        uStack_275c = local_1e88._4_4_;
        local_1e98._0_4_ = (undefined4)local_1cf8;
        local_2748 = (undefined4)local_1e98;
        local_1e98._4_4_ = (undefined4)((ulong)local_1cf8 >> 0x20);
        uStack_2740 = local_1e98._4_4_;
        local_1ea8._0_4_ = (undefined4)local_1d08;
        uStack_2744 = (undefined4)local_1ea8;
        local_1ea8._4_4_ = (undefined4)((ulong)local_1d08 >> 0x20);
        uStack_273c = local_1ea8._4_4_;
        uStack_1cd0._0_4_ = (undefined4)uStack_1e70;
        local_2758 = (undefined4)uStack_1cd0;
        uStack_1cd0._4_4_ = (undefined4)((ulong)uStack_1e70 >> 0x20);
        uStack_2750 = uStack_1cd0._4_4_;
        uStack_1ce0._0_4_ = (undefined4)uStack_1e80;
        uStack_2754 = (undefined4)uStack_1ce0;
        uStack_1ce0._4_4_ = (undefined4)((ulong)uStack_1e80 >> 0x20);
        uStack_274c = uStack_1ce0._4_4_;
        uStack_1cf0._0_4_ = (undefined4)uStack_1e90;
        local_2738 = (undefined4)uStack_1cf0;
        uStack_1cf0._4_4_ = (undefined4)((ulong)uStack_1e90 >> 0x20);
        uStack_2730 = uStack_1cf0._4_4_;
        uStack_1d00._0_4_ = (undefined4)uStack_1ea0;
        uStack_2734 = (undefined4)uStack_1d00;
        uStack_1d00._4_4_ = (undefined4)((ulong)uStack_1ea0 >> 0x20);
        uStack_272c = uStack_1d00._4_4_;
        local_1b58 = CONCAT44((undefined4)local_1e88,(undefined4)local_1e78);
        uStack_1b50 = CONCAT44(local_1e88._4_4_,local_1e78._4_4_);
        local_1b68 = CONCAT44((undefined4)local_1ea8,(undefined4)local_1e98);
        uStack_1b60 = CONCAT44(local_1ea8._4_4_,local_1e98._4_4_);
        local_26b8 = CONCAT44((undefined4)local_1e88,(undefined4)local_1e78);
        uStack_26b0 = CONCAT44((undefined4)local_1ea8,(undefined4)local_1e98);
        local_19d8 = CONCAT44((undefined4)local_1ea8,(undefined4)local_1e98);
        uStack_19d0 = CONCAT44(local_1ea8._4_4_,local_1e98._4_4_);
        local_19e8 = CONCAT44((undefined4)local_1e88,(undefined4)local_1e78);
        uStack_19e0 = CONCAT44(local_1e88._4_4_,local_1e78._4_4_);
        local_26c8 = CONCAT44(local_1e88._4_4_,local_1e78._4_4_);
        uStack_26c0 = CONCAT44(local_1ea8._4_4_,local_1e98._4_4_);
        local_1b78 = CONCAT44((undefined4)uStack_1ce0,(undefined4)uStack_1cd0);
        uStack_1b70 = CONCAT44(uStack_1ce0._4_4_,uStack_1cd0._4_4_);
        local_1b88 = CONCAT44((undefined4)uStack_1d00,(undefined4)uStack_1cf0);
        uStack_1b80 = CONCAT44(uStack_1d00._4_4_,uStack_1cf0._4_4_);
        local_26d8 = CONCAT44((undefined4)uStack_1ce0,(undefined4)uStack_1cd0);
        uStack_26d0 = CONCAT44((undefined4)uStack_1d00,(undefined4)uStack_1cf0);
        local_19f8 = CONCAT44((undefined4)uStack_1d00,(undefined4)uStack_1cf0);
        uStack_19f0 = CONCAT44(uStack_1d00._4_4_,uStack_1cf0._4_4_);
        local_1a08 = CONCAT44((undefined4)uStack_1ce0,(undefined4)uStack_1cd0);
        uStack_1a00 = CONCAT44(uStack_1ce0._4_4_,uStack_1cd0._4_4_);
        local_26e8 = CONCAT44(uStack_1ce0._4_4_,uStack_1cd0._4_4_);
        uStack_26e0 = CONCAT44(uStack_1d00._4_4_,uStack_1cf0._4_4_);
        local_1390 = local_2650;
        *local_2650 = local_2678;
        local_2650[1] = uStack_2670;
        local_13b0 = local_2650 + 2;
        *local_13b0 = local_26b8;
        local_2650[3] = uStack_26b0;
        local_13d0 = local_2650 + 4;
        local_13e8 = local_2688;
        uStack_13e0 = uStack_2680;
        *local_13d0 = local_2688;
        local_2650[5] = uStack_2680;
        local_13f0 = local_2650 + 6;
        local_1408 = local_26c8;
        uStack_1400 = uStack_26c0;
        *local_13f0 = local_26c8;
        local_2650[7] = uStack_26c0;
        local_1410 = local_2650 + 8;
        *local_1410 = local_2698;
        local_2650[9] = uStack_2690;
        local_1430 = local_2650 + 10;
        *local_1430 = local_26d8;
        local_2650[0xb] = uStack_26d0;
        local_1450 = local_2650 + 0xc;
        local_1468 = local_26a8;
        uStack_1460 = uStack_26a0;
        *local_1450 = local_26a8;
        local_2650[0xd] = uStack_26a0;
        local_1470 = local_2650 + 0xe;
        local_1488 = local_26e8;
        uStack_1480 = uStack_26e0;
        *local_1470 = local_26e8;
        local_2650[0xf] = uStack_26e0;
        local_2658 = local_2658 + (long)local_23d8[8] * 2;
        local_2650 = local_2650 + 0x10;
        local_1ea8 = local_1d08;
        local_1e98 = local_1cf8;
        local_1e88 = local_1ce8;
        local_1e78 = local_1cd8;
        local_1e68 = local_1cc8;
        local_1e58 = local_1cb8;
        local_1e48 = local_1ca8;
        local_1e38 = local_1c98;
        uStack_1d00 = uStack_1ea0;
        uStack_1cf0 = uStack_1e90;
        uStack_1ce0 = uStack_1e80;
        uStack_1cd0 = uStack_1e70;
        uStack_1cc0 = uStack_1e60;
        uStack_1cb0 = uStack_1e50;
        uStack_1ca0 = uStack_1e40;
        uStack_1c90 = uStack_1e30;
        local_1448 = local_26d8;
        uStack_1440 = uStack_26d0;
        local_1428 = local_2698;
        uStack_1420 = uStack_2690;
        local_13c8 = local_26b8;
        uStack_13c0 = uStack_26b0;
        local_13a8 = local_2678;
        uStack_13a0 = uStack_2670;
      }
    }
    for (; local_24ac + 3 < local_23fc; local_24ac = local_24ac + 4) {
      uVar2 = (long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                    (long)local_24ac % 0xc & 0xffffffffU) % 8;
      local_2034 = local_24ac / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                               (long)local_24ac % 0xc & 0xffffffffU) / 8) +
                   (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4)
      ;
      local_2030 = &local_24a8;
      local_2770 = (undefined8 *)((long)local_d0 + (long)local_2424 * (long)local_2034 * local_2440)
      ;
      local_20f8 = local_23d8;
      local_2778 = (undefined8 *)
                   ((long)*local_23d8 + (long)((local_2460 * local_23fc + local_24ac) * 4) * 4);
      for (local_277c = 0; local_277c < local_2404; local_277c = local_277c + 1) {
        local_1fb0 = local_2778;
        local_1d18 = *local_2778;
        uStack_1eb0 = local_2778[1];
        local_1fb8 = local_2778 + 2;
        local_1d28 = *local_1fb8;
        uStack_1ec0 = local_2778[3];
        local_1fc0 = local_2778 + 4;
        local_1d38 = *local_1fc0;
        uStack_1ed0 = local_2778[5];
        local_1fc8 = local_2778 + 6;
        local_1d48 = *local_1fc8;
        uStack_1ee0 = local_2778[7];
        local_1eb8._0_4_ = (undefined4)local_1d18;
        local_2808 = (undefined4)local_1eb8;
        local_1eb8._4_4_ = (undefined4)((ulong)local_1d18 >> 0x20);
        uStack_2800 = local_1eb8._4_4_;
        local_1ec8._0_4_ = (undefined4)local_1d28;
        uStack_2804 = (undefined4)local_1ec8;
        local_1ec8._4_4_ = (undefined4)((ulong)local_1d28 >> 0x20);
        uStack_27fc = local_1ec8._4_4_;
        local_1ed8._0_4_ = (undefined4)local_1d38;
        local_27e8 = (undefined4)local_1ed8;
        local_1ed8._4_4_ = (undefined4)((ulong)local_1d38 >> 0x20);
        uStack_27e0 = local_1ed8._4_4_;
        local_1ee8._0_4_ = (undefined4)local_1d48;
        uStack_27e4 = (undefined4)local_1ee8;
        local_1ee8._4_4_ = (undefined4)((ulong)local_1d48 >> 0x20);
        uStack_27dc = local_1ee8._4_4_;
        uStack_1d10._0_4_ = (undefined4)uStack_1eb0;
        local_27f8 = (undefined4)uStack_1d10;
        uStack_1d10._4_4_ = (undefined4)((ulong)uStack_1eb0 >> 0x20);
        uStack_27f0 = uStack_1d10._4_4_;
        uStack_1d20._0_4_ = (undefined4)uStack_1ec0;
        uStack_27f4 = (undefined4)uStack_1d20;
        uStack_1d20._4_4_ = (undefined4)((ulong)uStack_1ec0 >> 0x20);
        uStack_27ec = uStack_1d20._4_4_;
        uStack_1d30._0_4_ = (undefined4)uStack_1ed0;
        local_27d8 = (undefined4)uStack_1d30;
        uStack_1d30._4_4_ = (undefined4)((ulong)uStack_1ed0 >> 0x20);
        uStack_27d0 = uStack_1d30._4_4_;
        uStack_1d40._0_4_ = (undefined4)uStack_1ee0;
        uStack_27d4 = (undefined4)uStack_1d40;
        uStack_1d40._4_4_ = (undefined4)((ulong)uStack_1ee0 >> 0x20);
        uStack_27cc = uStack_1d40._4_4_;
        local_1b98 = CONCAT44((undefined4)local_1ec8,(undefined4)local_1eb8);
        uStack_1b90 = CONCAT44(local_1ec8._4_4_,local_1eb8._4_4_);
        local_1ba8 = CONCAT44((undefined4)local_1ee8,(undefined4)local_1ed8);
        uStack_1ba0 = CONCAT44(local_1ee8._4_4_,local_1ed8._4_4_);
        local_2798 = CONCAT44((undefined4)local_1ec8,(undefined4)local_1eb8);
        uStack_2790 = CONCAT44((undefined4)local_1ee8,(undefined4)local_1ed8);
        local_1a18 = CONCAT44((undefined4)local_1ee8,(undefined4)local_1ed8);
        uStack_1a10 = CONCAT44(local_1ee8._4_4_,local_1ed8._4_4_);
        local_1a28 = CONCAT44((undefined4)local_1ec8,(undefined4)local_1eb8);
        uStack_1a20 = CONCAT44(local_1ec8._4_4_,local_1eb8._4_4_);
        local_27a8 = CONCAT44(local_1ec8._4_4_,local_1eb8._4_4_);
        uStack_27a0 = CONCAT44(local_1ee8._4_4_,local_1ed8._4_4_);
        local_1bb8 = CONCAT44((undefined4)uStack_1d20,(undefined4)uStack_1d10);
        uStack_1bb0 = CONCAT44(uStack_1d20._4_4_,uStack_1d10._4_4_);
        local_1bc8 = CONCAT44((undefined4)uStack_1d40,(undefined4)uStack_1d30);
        uStack_1bc0 = CONCAT44(uStack_1d40._4_4_,uStack_1d30._4_4_);
        local_27b8 = CONCAT44((undefined4)uStack_1d20,(undefined4)uStack_1d10);
        uStack_27b0 = CONCAT44((undefined4)uStack_1d40,(undefined4)uStack_1d30);
        local_1a38 = CONCAT44((undefined4)uStack_1d40,(undefined4)uStack_1d30);
        uStack_1a30 = CONCAT44(uStack_1d40._4_4_,uStack_1d30._4_4_);
        local_1a48 = CONCAT44((undefined4)uStack_1d20,(undefined4)uStack_1d10);
        uStack_1a40 = CONCAT44(uStack_1d20._4_4_,uStack_1d10._4_4_);
        local_27c8 = CONCAT44(uStack_1d20._4_4_,uStack_1d10._4_4_);
        uStack_27c0 = CONCAT44(uStack_1d40._4_4_,uStack_1d30._4_4_);
        local_1490 = local_2770;
        *local_2770 = local_2798;
        local_2770[1] = uStack_2790;
        local_14b0 = local_2770 + 2;
        local_14c8 = local_27a8;
        uStack_14c0 = uStack_27a0;
        *local_14b0 = local_27a8;
        local_2770[3] = uStack_27a0;
        local_14d0 = local_2770 + 4;
        *local_14d0 = local_27b8;
        local_2770[5] = uStack_27b0;
        local_14f0 = local_2770 + 6;
        local_1508 = local_27c8;
        uStack_1500 = uStack_27c0;
        *local_14f0 = local_27c8;
        local_2770[7] = uStack_27c0;
        local_2778 = local_2778 + (long)local_23d8[8] * 2;
        local_2770 = local_2770 + 8;
        local_1ee8 = local_1d48;
        local_1ed8 = local_1d38;
        local_1ec8 = local_1d28;
        local_1eb8 = local_1d18;
        uStack_1d40 = uStack_1ee0;
        uStack_1d30 = uStack_1ed0;
        uStack_1d20 = uStack_1ec0;
        uStack_1d10 = uStack_1eb0;
        local_14e8 = local_27b8;
        uStack_14e0 = uStack_27b0;
        local_14a8 = local_2798;
        uStack_14a0 = uStack_2790;
      }
    }
    for (; local_24ac + 1 < local_23fc; local_24ac = local_24ac + 2) {
      uVar2 = (long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                    (long)local_24ac % 0xc & 0xffffffffU) % 8;
      uVar3 = (long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                    (long)local_24ac % 0xc & 0xffffffffU) % 4;
      local_2044 = local_24ac / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                               (long)local_24ac % 0xc & 0xffffffffU) / 8) +
                   (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4)
                   + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                          2);
      local_2040 = &local_24a8;
      local_2810 = (undefined8 *)((long)local_d0 + (long)local_2424 * (long)local_2044 * local_2440)
      ;
      local_2100 = local_23d8;
      local_2818 = (undefined8 *)
                   ((long)*local_23d8 + (long)((local_2460 * local_23fc + local_24ac) * 4) * 4);
      for (local_281c = 0; local_281c < local_2404; local_281c = local_281c + 1) {
        local_1fd0 = local_2818;
        local_2838 = *local_2818;
        uStack_2830 = local_2818[1];
        local_1fd8 = local_2818 + 2;
        local_2848 = *local_1fd8;
        uStack_2840 = local_2818[3];
        local_1ef8._0_4_ = (undefined4)local_2838;
        local_2858 = (undefined4)local_1ef8;
        local_1ef8._4_4_ = (undefined4)((ulong)local_2838 >> 0x20);
        uStack_2850 = local_1ef8._4_4_;
        local_1f08._0_4_ = (undefined4)local_2848;
        uStack_2854 = (undefined4)local_1f08;
        local_1f08._4_4_ = (undefined4)((ulong)local_2848 >> 0x20);
        uStack_284c = local_1f08._4_4_;
        uStack_1d50._0_4_ = (undefined4)uStack_2830;
        local_2868 = (undefined4)uStack_1d50;
        uStack_1d50._4_4_ = (undefined4)((ulong)uStack_2830 >> 0x20);
        uStack_2860 = uStack_1d50._4_4_;
        uStack_1d60._0_4_ = (undefined4)uStack_2840;
        uStack_2864 = (undefined4)uStack_1d60;
        uStack_1d60._4_4_ = (undefined4)((ulong)uStack_2840 >> 0x20);
        uStack_285c = uStack_1d60._4_4_;
        local_1510 = local_2810;
        local_1528 = CONCAT44((undefined4)local_1f08,(undefined4)local_1ef8);
        uStack_1520 = CONCAT44(local_1f08._4_4_,local_1ef8._4_4_);
        *local_2810 = local_1528;
        local_2810[1] = uStack_1520;
        local_1530 = local_2810 + 2;
        local_1548 = CONCAT44((undefined4)uStack_1d60,(undefined4)uStack_1d50);
        uStack_1540 = CONCAT44(uStack_1d60._4_4_,uStack_1d50._4_4_);
        *local_1530 = local_1548;
        local_2810[3] = uStack_1540;
        local_2818 = local_2818 + (long)local_23d8[8] * 2;
        local_2810 = local_2810 + 4;
        local_1f08 = local_2848;
        uStack_1f00 = uStack_2840;
        local_1ef8 = local_2838;
        uStack_1ef0 = uStack_2830;
        local_1d68 = local_2848;
        uStack_1d60 = uStack_2840;
        local_1d58 = local_2838;
        uStack_1d50 = uStack_2830;
      }
    }
    for (; local_24ac < local_23fc; local_24ac = local_24ac + 1) {
      uVar2 = (long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                    (long)local_24ac % 0xc & 0xffffffffU) % 8;
      uVar3 = (long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                    (long)local_24ac % 0xc & 0xffffffffU) % 4;
      local_2054 = local_24ac / 0xc +
                   (int)((long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                               (long)local_24ac % 0xc & 0xffffffffU) / 8) +
                   (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4)
                   + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                          2) +
                   (int)((long)((ulong)(uint)((int)((long)local_24ac % 0xc) >> 0x1f) << 0x20 |
                               (long)local_24ac % 0xc & 0xffffffffU) % 2);
      local_2050 = &local_24a8;
      local_2870 = (undefined8 *)((long)local_d0 + (long)local_2424 * (long)local_2054 * local_2440)
      ;
      local_2108 = local_23d8;
      local_2878 = (undefined8 *)
                   ((long)*local_23d8 + (long)((local_2460 * local_23fc + local_24ac) * 4) * 4);
      for (local_287c = 0; local_287c < local_2404; local_287c = local_287c + 1) {
        local_1fe0 = local_2878;
        local_2898 = *local_2878;
        uStack_2890 = local_2878[1];
        local_1550 = local_2870;
        *local_2870 = local_2898;
        local_2870[1] = uStack_2890;
        local_2878 = local_2878 + (long)local_23d8[8] * 2;
        local_2870 = local_2870 + 2;
        local_1568 = local_2898;
        uStack_1560 = uStack_2890;
      }
    }
    local_23c0 = &local_24a8;
    local_24a8 = 0;
    local_2498 = 0;
    local_2490 = 0;
    local_2480 = 0;
    local_247c = 0;
    local_2478 = 0;
    local_2474 = 0;
    local_2470 = 0;
    local_2468 = 0;
    local_24a0 = 0;
    local_2278 = local_23c0;
  }
  local_23c8 = &local_28e0;
  local_28e0 = (void *)0x0;
  local_28d8 = (int *)0x0;
  local_28d0 = 0;
  local_28c8 = 0;
  local_28c0 = (long *)0x0;
  local_28b8 = 0;
  local_28b4 = 0;
  local_28b0 = 0;
  local_28ac = 0;
  local_28a8 = 0;
  local_28a0 = 0;
  local_2350 = local_23d8;
  local_2358 = &local_28e0;
  if (local_23d8 != local_2358) {
    local_2338 = local_23d8;
    if (local_23d8[1] != (void *)0x0) {
      piVar1 = (int *)local_23d8[1];
      local_233c = 0xffffffff;
      LOCK();
      local_2340 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_2340 == 1) {
        if (local_23d8[4] == (void *)0x0) {
          local_2060 = *local_23d8;
          if (local_2060 != (void *)0x0) {
            free(local_2060);
          }
        }
        else {
          (**(code **)(*local_23d8[4] + 0x18))(local_23d8[4],*local_23d8);
        }
      }
    }
    *local_23d8 = (void *)0x0;
    local_23d8[2] = (void *)0x0;
    *(undefined4 *)(local_23d8 + 3) = 0;
    *(undefined4 *)(local_23d8 + 5) = 0;
    *(undefined4 *)((long)local_23d8 + 0x2c) = 0;
    *(undefined4 *)(local_23d8 + 6) = 0;
    *(undefined4 *)((long)local_23d8 + 0x34) = 0;
    *(undefined4 *)(local_23d8 + 7) = 0;
    local_23d8[8] = (void *)0x0;
    local_23d8[1] = (void *)0x0;
    *local_23d8 = *local_2358;
    local_23d8[1] = local_2358[1];
    local_23d8[2] = local_2358[2];
    *(undefined4 *)(local_23d8 + 3) = *(undefined4 *)(local_2358 + 3);
    local_23d8[4] = local_2358[4];
    *(undefined4 *)(local_23d8 + 5) = *(undefined4 *)(local_2358 + 5);
    *(undefined4 *)((long)local_23d8 + 0x2c) = *(undefined4 *)((long)local_2358 + 0x2c);
    *(undefined4 *)(local_23d8 + 6) = *(undefined4 *)(local_2358 + 6);
    *(undefined4 *)((long)local_23d8 + 0x34) = *(undefined4 *)((long)local_2358 + 0x34);
    *(undefined4 *)(local_23d8 + 7) = *(undefined4 *)(local_2358 + 7);
    local_23d8[8] = local_2358[8];
  }
  local_23b0 = &local_28e0;
  local_2298 = local_23b0;
  if (local_28d8 != (int *)0x0) {
    local_229c = 0xffffffff;
    LOCK();
    local_22a0 = *local_28d8;
    *local_28d8 = *local_28d8 + -1;
    UNLOCK();
    if (local_22a0 == 1) {
      if (local_28c0 == (long *)0x0) {
        local_20b0 = local_28e0;
        if (local_28e0 != (void *)0x0) {
          free(local_28e0);
        }
      }
      else {
        (**(code **)(*local_28c0 + 0x18))(local_28c0,local_28e0);
      }
    }
  }
  local_28e0 = (void *)0x0;
  local_28d0 = 0;
  local_28c8 = 0;
  local_28b8 = 0;
  local_28b4 = 0;
  local_28b0 = 0;
  local_28ac = 0;
  local_28a8 = 0;
  local_28a0 = 0;
  local_28d8 = (int *)0x0;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcca4,in_stack_ffffffffffffcca0),
              in_stack_ffffffffffffcc9c,in_stack_ffffffffffffcc98,_c,in_stack_ffffffffffffcc88,
              _elempack,in_stack_ffffffffffffcd00);
  for (local_28e4 = 0; local_28e4 < local_23dc; local_28e4 = local_28e4 + 1) {
    local_2230 = &local_2938;
    local_84 = *(int *)((long)local_23f0 + 0x2c);
    local_88 = (int)local_23f0[6];
    local_8c = *(undefined4 *)((long)local_23f0 + 0x34);
    local_98 = (float *)(*local_23f0 + local_23f0[8] * (long)local_28e4 * local_23f0[2]);
    local_a0 = local_23f0[2];
    local_a4 = (undefined4)local_23f0[3];
    local_b0 = local_23f0[4];
    local_80 = &local_2938;
    local_28 = (long)local_84 * (long)local_88 * local_a0;
    local_21e0 = &local_2938;
    local_23a0 = &local_2938;
    local_2c = 0x10;
    local_2128 = &local_2980;
    local_f4 = *(int *)((long)local_23e8 + 0x2c);
    local_f8 = (int)local_23e8[6];
    local_fc = *(undefined4 *)((long)local_23e8 + 0x34);
    local_108 = *local_23e8 + local_23e8[8] * (long)local_28e4 * local_23e8[2];
    local_110 = local_23e8[2];
    local_114 = (undefined4)local_23e8[3];
    local_120 = local_23e8[4];
    local_f0 = &local_2980;
    local_8 = (long)local_f4 * (long)local_f8 * local_110;
    local_c = 0x10;
    local_28f0 = local_98;
    for (local_2984 = 0; local_2984 < local_2400; local_2984 = local_2984 + 1) {
      local_2260 = &local_29d0;
      local_2268 = &local_2450;
      local_60 = (void *)((long)local_2450 + local_2410 * local_2984 * local_2440);
      local_48 = &local_29d0;
      local_38 = (long)local_2424 * (long)local_2420 * local_2440;
      for (local_29d4 = 0; local_29d4 + 0xb < local_23fc; local_29d4 = local_29d4 + 0xc) {
        local_2144 = local_29d4 / 0xc;
        local_2140 = &local_29d0;
        local_29e0 = (float *)((long)local_60 + (long)local_2424 * (long)local_2144 * local_2440);
        local_2154 = local_2984;
        local_2150 = &local_2980;
        local_29e8 = (undefined8 *)(local_108 + (long)local_f4 * (long)local_2984 * local_110);
        local_138 = 0;
        uStack_130 = 0;
        local_2a08 = 0;
        uStack_2a00 = 0;
        local_148 = 0;
        uStack_140 = 0;
        local_2a18 = 0;
        uStack_2a10 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_2a28 = 0;
        uStack_2a20 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_2a38 = 0;
        uStack_2a30 = 0;
        local_178 = 0;
        uStack_170 = 0;
        local_2a48 = 0;
        uStack_2a40 = 0;
        local_188 = 0;
        uStack_180 = 0;
        local_2a58 = 0;
        uStack_2a50 = 0;
        local_198 = 0;
        uStack_190 = 0;
        local_2a68 = 0;
        uStack_2a60 = 0;
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_2a78 = 0;
        uStack_2a70 = 0;
        local_1b8 = 0;
        uStack_1b0 = 0;
        local_2a88 = 0;
        uStack_2a80 = 0;
        local_1c8 = 0;
        uStack_1c0 = 0;
        local_2a98 = 0;
        uStack_2a90 = 0;
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_2aa8 = 0;
        uStack_2aa0 = 0;
        local_1e8 = 0;
        uStack_1e0 = 0;
        local_2ab8 = 0;
        uStack_2ab0 = 0;
        local_2abc = 0;
        while( true ) {
          uVar5 = uStack_830;
          uVar4 = local_838;
          local_838._0_4_ = (float)local_2ab8;
          local_838._4_4_ = (float)((ulong)local_2ab8 >> 0x20);
          uStack_830._0_4_ = (float)uStack_2ab0;
          uStack_830._4_4_ = (float)((ulong)uStack_2ab0 >> 0x20);
          if (local_2404 << 2 <= local_2abc) break;
          local_1fe8 = local_29e8;
          local_bc8 = *local_29e8;
          uStack_bc0 = local_29e8[1];
          local_eb0 = local_29e0;
          local_ec8 = *local_29e0;
          local_9a8 = CONCAT44(local_ec8,local_ec8);
          uStack_9a0 = CONCAT44(local_ec8,local_ec8);
          local_ed0 = local_29e0 + 1;
          local_ee8 = *local_ed0;
          local_9d8 = CONCAT44(local_ee8,local_ee8);
          uStack_9d0 = CONCAT44(local_ee8,local_ee8);
          local_ef0 = local_29e0 + 2;
          local_f08 = *local_ef0;
          local_a08 = CONCAT44(local_f08,local_f08);
          uStack_a00 = CONCAT44(local_f08,local_f08);
          local_f10 = local_29e0 + 3;
          local_f28 = *local_f10;
          local_a38 = CONCAT44(local_f28,local_f28);
          uStack_a30 = CONCAT44(local_f28,local_f28);
          local_f30 = local_29e0 + 4;
          local_f48 = *local_f30;
          local_a68 = CONCAT44(local_f48,local_f48);
          uStack_a60 = CONCAT44(local_f48,local_f48);
          local_f50 = local_29e0 + 5;
          local_f68 = *local_f50;
          local_a98 = CONCAT44(local_f68,local_f68);
          uStack_a90 = CONCAT44(local_f68,local_f68);
          local_f70 = local_29e0 + 6;
          local_f88 = *local_f70;
          local_ac8 = CONCAT44(local_f88,local_f88);
          uStack_ac0 = CONCAT44(local_f88,local_f88);
          local_f90 = local_29e0 + 7;
          local_fa8 = *local_f90;
          local_af8 = CONCAT44(local_fa8,local_fa8);
          uStack_af0 = CONCAT44(local_fa8,local_fa8);
          local_fb0 = local_29e0 + 8;
          local_fc8 = *local_fb0;
          local_b28 = CONCAT44(local_fc8,local_fc8);
          uStack_b20 = CONCAT44(local_fc8,local_fc8);
          local_fd0 = local_29e0 + 9;
          local_fe8 = *local_fd0;
          local_b58 = CONCAT44(local_fe8,local_fe8);
          uStack_b50 = CONCAT44(local_fe8,local_fe8);
          local_ff0 = local_29e0 + 10;
          local_1008 = *local_ff0;
          local_b88 = CONCAT44(local_1008,local_1008);
          uStack_b80 = CONCAT44(local_1008,local_1008);
          pfStack_1010 = local_29e0 + 0xb;
          local_1028 = *pfStack_1010;
          local_bb8 = CONCAT44(local_1028,local_1028);
          uStack_bb0 = CONCAT44(local_1028,local_1028);
          local_9c8 = local_2a08;
          uStack_9c0 = uStack_2a00;
          local_638._0_4_ = (float)local_bc8;
          local_638._4_4_ = (float)((ulong)local_bc8 >> 0x20);
          uStack_630._0_4_ = (float)uStack_bc0;
          uStack_630._4_4_ = (float)((ulong)uStack_bc0 >> 0x20);
          local_988 = local_ec8 * (float)local_638;
          fStack_984 = local_ec8 * local_638._4_4_;
          fStack_980 = local_ec8 * (float)uStack_630;
          fStack_97c = local_ec8 * uStack_630._4_4_;
          uVar4 = local_2a08;
          uVar5 = uStack_2a00;
          local_998._0_4_ = (float)local_2a08;
          local_998._4_4_ = (float)((ulong)local_2a08 >> 0x20);
          uStack_990._0_4_ = (float)uStack_2a00;
          uStack_990._4_4_ = (float)((ulong)uStack_2a00 >> 0x20);
          local_2a08 = CONCAT44(fStack_984 + local_998._4_4_,local_988 + (float)local_998);
          uStack_2a00 = CONCAT44(fStack_97c + uStack_990._4_4_,fStack_980 + (float)uStack_990);
          local_9f8 = local_2a18;
          uStack_9f0 = uStack_2a10;
          local_968 = local_ee8 * (float)local_638;
          fStack_964 = local_ee8 * local_638._4_4_;
          fStack_960 = local_ee8 * (float)uStack_630;
          fStack_95c = local_ee8 * uStack_630._4_4_;
          uVar6 = local_2a18;
          uVar7 = uStack_2a10;
          local_978._0_4_ = (float)local_2a18;
          local_978._4_4_ = (float)((ulong)local_2a18 >> 0x20);
          uStack_970._0_4_ = (float)uStack_2a10;
          uStack_970._4_4_ = (float)((ulong)uStack_2a10 >> 0x20);
          local_2a18 = CONCAT44(fStack_964 + local_978._4_4_,local_968 + (float)local_978);
          uStack_2a10 = CONCAT44(fStack_95c + uStack_970._4_4_,fStack_960 + (float)uStack_970);
          local_a28 = local_2a28;
          uStack_a20 = uStack_2a20;
          local_948 = local_f08 * (float)local_638;
          fStack_944 = local_f08 * local_638._4_4_;
          fStack_940 = local_f08 * (float)uStack_630;
          fStack_93c = local_f08 * uStack_630._4_4_;
          uVar8 = local_2a28;
          uVar9 = uStack_2a20;
          local_958._0_4_ = (float)local_2a28;
          local_958._4_4_ = (float)((ulong)local_2a28 >> 0x20);
          uStack_950._0_4_ = (float)uStack_2a20;
          uStack_950._4_4_ = (float)((ulong)uStack_2a20 >> 0x20);
          local_2a28 = CONCAT44(fStack_944 + local_958._4_4_,local_948 + (float)local_958);
          uStack_2a20 = CONCAT44(fStack_93c + uStack_950._4_4_,fStack_940 + (float)uStack_950);
          local_a58 = local_2a38;
          uStack_a50 = uStack_2a30;
          local_928 = local_f28 * (float)local_638;
          fStack_924 = local_f28 * local_638._4_4_;
          fStack_920 = local_f28 * (float)uStack_630;
          fStack_91c = local_f28 * uStack_630._4_4_;
          uVar10 = local_2a38;
          uVar11 = uStack_2a30;
          local_938._0_4_ = (float)local_2a38;
          local_938._4_4_ = (float)((ulong)local_2a38 >> 0x20);
          uStack_930._0_4_ = (float)uStack_2a30;
          uStack_930._4_4_ = (float)((ulong)uStack_2a30 >> 0x20);
          local_2a38 = CONCAT44(fStack_924 + local_938._4_4_,local_928 + (float)local_938);
          uStack_2a30 = CONCAT44(fStack_91c + uStack_930._4_4_,fStack_920 + (float)uStack_930);
          local_a88 = local_2a48;
          uStack_a80 = uStack_2a40;
          local_908 = local_f48 * (float)local_638;
          fStack_904 = local_f48 * local_638._4_4_;
          fStack_900 = local_f48 * (float)uStack_630;
          fStack_8fc = local_f48 * uStack_630._4_4_;
          uVar12 = local_2a48;
          uVar13 = uStack_2a40;
          local_918._0_4_ = (float)local_2a48;
          local_918._4_4_ = (float)((ulong)local_2a48 >> 0x20);
          uStack_910._0_4_ = (float)uStack_2a40;
          uStack_910._4_4_ = (float)((ulong)uStack_2a40 >> 0x20);
          local_2a48 = CONCAT44(fStack_904 + local_918._4_4_,local_908 + (float)local_918);
          uStack_2a40 = CONCAT44(fStack_8fc + uStack_910._4_4_,fStack_900 + (float)uStack_910);
          local_ab8 = local_2a58;
          uStack_ab0 = uStack_2a50;
          local_8e8 = local_f68 * (float)local_638;
          fStack_8e4 = local_f68 * local_638._4_4_;
          fStack_8e0 = local_f68 * (float)uStack_630;
          fStack_8dc = local_f68 * uStack_630._4_4_;
          uVar14 = local_2a58;
          uVar15 = uStack_2a50;
          local_8f8._0_4_ = (float)local_2a58;
          local_8f8._4_4_ = (float)((ulong)local_2a58 >> 0x20);
          uStack_8f0._0_4_ = (float)uStack_2a50;
          uStack_8f0._4_4_ = (float)((ulong)uStack_2a50 >> 0x20);
          local_2a58 = CONCAT44(fStack_8e4 + local_8f8._4_4_,local_8e8 + (float)local_8f8);
          uStack_2a50 = CONCAT44(fStack_8dc + uStack_8f0._4_4_,fStack_8e0 + (float)uStack_8f0);
          local_ae8 = local_2a68;
          uStack_ae0 = uStack_2a60;
          local_8c8 = local_f88 * (float)local_638;
          fStack_8c4 = local_f88 * local_638._4_4_;
          fStack_8c0 = local_f88 * (float)uStack_630;
          fStack_8bc = local_f88 * uStack_630._4_4_;
          uVar16 = local_2a68;
          uVar17 = uStack_2a60;
          local_8d8._0_4_ = (float)local_2a68;
          local_8d8._4_4_ = (float)((ulong)local_2a68 >> 0x20);
          uStack_8d0._0_4_ = (float)uStack_2a60;
          uStack_8d0._4_4_ = (float)((ulong)uStack_2a60 >> 0x20);
          local_2a68 = CONCAT44(fStack_8c4 + local_8d8._4_4_,local_8c8 + (float)local_8d8);
          uStack_2a60 = CONCAT44(fStack_8bc + uStack_8d0._4_4_,fStack_8c0 + (float)uStack_8d0);
          local_b18 = local_2a78;
          uStack_b10 = uStack_2a70;
          local_8a8 = local_fa8 * (float)local_638;
          fStack_8a4 = local_fa8 * local_638._4_4_;
          fStack_8a0 = local_fa8 * (float)uStack_630;
          fStack_89c = local_fa8 * uStack_630._4_4_;
          uVar18 = local_2a78;
          uVar19 = uStack_2a70;
          local_8b8._0_4_ = (float)local_2a78;
          local_8b8._4_4_ = (float)((ulong)local_2a78 >> 0x20);
          uStack_8b0._0_4_ = (float)uStack_2a70;
          uStack_8b0._4_4_ = (float)((ulong)uStack_2a70 >> 0x20);
          local_2a78 = CONCAT44(fStack_8a4 + local_8b8._4_4_,local_8a8 + (float)local_8b8);
          uStack_2a70 = CONCAT44(fStack_89c + uStack_8b0._4_4_,fStack_8a0 + (float)uStack_8b0);
          local_b48 = local_2a88;
          uStack_b40 = uStack_2a80;
          local_888 = local_fc8 * (float)local_638;
          fStack_884 = local_fc8 * local_638._4_4_;
          fStack_880 = local_fc8 * (float)uStack_630;
          fStack_87c = local_fc8 * uStack_630._4_4_;
          uVar20 = local_2a88;
          uVar21 = uStack_2a80;
          local_898._0_4_ = (float)local_2a88;
          local_898._4_4_ = (float)((ulong)local_2a88 >> 0x20);
          uStack_890._0_4_ = (float)uStack_2a80;
          uStack_890._4_4_ = (float)((ulong)uStack_2a80 >> 0x20);
          local_2a88 = CONCAT44(fStack_884 + local_898._4_4_,local_888 + (float)local_898);
          uStack_2a80 = CONCAT44(fStack_87c + uStack_890._4_4_,fStack_880 + (float)uStack_890);
          local_b78 = local_2a98;
          uStack_b70 = uStack_2a90;
          local_868 = local_fe8 * (float)local_638;
          fStack_864 = local_fe8 * local_638._4_4_;
          fStack_860 = local_fe8 * (float)uStack_630;
          fStack_85c = local_fe8 * uStack_630._4_4_;
          uVar22 = local_2a98;
          uVar23 = uStack_2a90;
          local_878._0_4_ = (float)local_2a98;
          local_878._4_4_ = (float)((ulong)local_2a98 >> 0x20);
          uStack_870._0_4_ = (float)uStack_2a90;
          uStack_870._4_4_ = (float)((ulong)uStack_2a90 >> 0x20);
          local_2a98 = CONCAT44(fStack_864 + local_878._4_4_,local_868 + (float)local_878);
          uStack_2a90 = CONCAT44(fStack_85c + uStack_870._4_4_,fStack_860 + (float)uStack_870);
          local_ba8 = local_2aa8;
          uStack_ba0 = uStack_2aa0;
          local_848 = local_1008 * (float)local_638;
          fStack_844 = local_1008 * local_638._4_4_;
          fStack_840 = local_1008 * (float)uStack_630;
          fStack_83c = local_1008 * uStack_630._4_4_;
          uVar24 = local_2aa8;
          uVar25 = uStack_2aa0;
          local_858._0_4_ = (float)local_2aa8;
          local_858._4_4_ = (float)((ulong)local_2aa8 >> 0x20);
          uStack_850._0_4_ = (float)uStack_2aa0;
          uStack_850._4_4_ = (float)((ulong)uStack_2aa0 >> 0x20);
          local_2aa8 = CONCAT44(fStack_844 + local_858._4_4_,local_848 + (float)local_858);
          uStack_2aa0 = CONCAT44(fStack_83c + uStack_850._4_4_,fStack_840 + (float)uStack_850);
          local_bd8 = local_2ab8;
          uStack_bd0 = uStack_2ab0;
          local_828 = local_1028 * (float)local_638;
          fStack_824 = local_1028 * local_638._4_4_;
          fStack_820 = local_1028 * (float)uStack_630;
          fStack_81c = local_1028 * uStack_630._4_4_;
          uVar26 = local_2ab8;
          uVar27 = uStack_2ab0;
          local_2ab8 = CONCAT44(fStack_824 + local_838._4_4_,local_828 + (float)local_838);
          uStack_2ab0 = CONCAT44(fStack_81c + uStack_830._4_4_,fStack_820 + (float)uStack_830);
          local_29e0 = local_29e0 + 0xc;
          local_29e8 = local_29e8 + 2;
          local_2abc = local_2abc + 1;
          fStack_1024 = local_1028;
          fStack_1020 = local_1028;
          fStack_101c = local_1028;
          local_1018 = local_1028;
          fStack_1004 = local_1008;
          fStack_1000 = local_1008;
          fStack_ffc = local_1008;
          local_ff4 = local_1008;
          fStack_fe4 = local_fe8;
          fStack_fe0 = local_fe8;
          fStack_fdc = local_fe8;
          local_fd4 = local_fe8;
          fStack_fc4 = local_fc8;
          fStack_fc0 = local_fc8;
          fStack_fbc = local_fc8;
          local_fb4 = local_fc8;
          fStack_fa4 = local_fa8;
          fStack_fa0 = local_fa8;
          fStack_f9c = local_fa8;
          local_f94 = local_fa8;
          fStack_f84 = local_f88;
          fStack_f80 = local_f88;
          fStack_f7c = local_f88;
          local_f74 = local_f88;
          fStack_f64 = local_f68;
          fStack_f60 = local_f68;
          fStack_f5c = local_f68;
          local_f54 = local_f68;
          fStack_f44 = local_f48;
          fStack_f40 = local_f48;
          fStack_f3c = local_f48;
          local_f34 = local_f48;
          fStack_f24 = local_f28;
          fStack_f20 = local_f28;
          fStack_f1c = local_f28;
          local_f14 = local_f28;
          fStack_f04 = local_f08;
          fStack_f00 = local_f08;
          fStack_efc = local_f08;
          local_ef4 = local_f08;
          fStack_ee4 = local_ee8;
          fStack_ee0 = local_ee8;
          fStack_edc = local_ee8;
          local_ed4 = local_ee8;
          fStack_ec4 = local_ec8;
          fStack_ec0 = local_ec8;
          fStack_ebc = local_ec8;
          local_eb4 = local_ec8;
          local_b98 = local_bc8;
          uStack_b90 = uStack_bc0;
          local_b68 = local_bc8;
          uStack_b60 = uStack_bc0;
          local_b38 = local_bc8;
          uStack_b30 = uStack_bc0;
          local_b08 = local_bc8;
          uStack_b00 = uStack_bc0;
          local_ad8 = local_bc8;
          uStack_ad0 = uStack_bc0;
          local_aa8 = local_bc8;
          uStack_aa0 = uStack_bc0;
          local_a78 = local_bc8;
          uStack_a70 = uStack_bc0;
          local_a48 = local_bc8;
          uStack_a40 = uStack_bc0;
          local_a18 = local_bc8;
          uStack_a10 = uStack_bc0;
          local_9e8 = local_bc8;
          uStack_9e0 = uStack_bc0;
          local_9b8 = local_bc8;
          uStack_9b0 = uStack_bc0;
          local_998 = uVar4;
          uStack_990 = uVar5;
          local_978 = uVar6;
          uStack_970 = uVar7;
          local_958 = uVar8;
          uStack_950 = uVar9;
          local_938 = uVar10;
          uStack_930 = uVar11;
          local_918 = uVar12;
          uStack_910 = uVar13;
          local_8f8 = uVar14;
          uStack_8f0 = uVar15;
          local_8d8 = uVar16;
          uStack_8d0 = uVar17;
          local_8b8 = uVar18;
          uStack_8b0 = uVar19;
          local_898 = uVar20;
          uStack_890 = uVar21;
          local_878 = uVar22;
          uStack_870 = uVar23;
          local_858 = uVar24;
          uStack_850 = uVar25;
          local_838 = uVar26;
          uStack_830 = uVar27;
          local_638 = local_bc8;
          uStack_630 = uStack_bc0;
          local_628 = local_9a8;
          uStack_620 = uStack_9a0;
          local_618 = local_bc8;
          uStack_610 = uStack_bc0;
          local_608 = local_9d8;
          uStack_600 = uStack_9d0;
          local_5f8 = local_bc8;
          uStack_5f0 = uStack_bc0;
          local_5e8 = local_a08;
          uStack_5e0 = uStack_a00;
          local_5d8 = local_bc8;
          uStack_5d0 = uStack_bc0;
          local_5c8 = local_a38;
          uStack_5c0 = uStack_a30;
          local_5b8 = local_bc8;
          uStack_5b0 = uStack_bc0;
          local_5a8 = local_a68;
          uStack_5a0 = uStack_a60;
          local_598 = local_bc8;
          uStack_590 = uStack_bc0;
          local_588 = local_a98;
          uStack_580 = uStack_a90;
          local_578 = local_bc8;
          uStack_570 = uStack_bc0;
          local_568 = local_ac8;
          uStack_560 = uStack_ac0;
          local_558 = local_bc8;
          uStack_550 = uStack_bc0;
          local_548 = local_af8;
          uStack_540 = uStack_af0;
          local_538 = local_bc8;
          uStack_530 = uStack_bc0;
          local_528 = local_b28;
          uStack_520 = uStack_b20;
          local_518 = local_bc8;
          uStack_510 = uStack_bc0;
          local_508 = local_b58;
          uStack_500 = uStack_b50;
          local_4f8 = local_bc8;
          uStack_4f0 = uStack_bc0;
          local_4e8 = local_b88;
          uStack_4e0 = uStack_b80;
          local_4d8 = local_bc8;
          uStack_4d0 = uStack_bc0;
          local_4c8 = local_bb8;
          uStack_4c0 = uStack_bb0;
        }
        local_1570 = local_28f0;
        local_1588 = local_2a08;
        uStack_1580 = uStack_2a00;
        *(undefined8 *)local_28f0 = local_2a08;
        *(undefined8 *)(local_28f0 + 2) = uStack_2a00;
        local_1590 = local_28f0 + 4;
        local_15a8 = local_2a18;
        uStack_15a0 = uStack_2a10;
        *(undefined8 *)local_1590 = local_2a18;
        *(undefined8 *)(local_28f0 + 6) = uStack_2a10;
        local_15b0 = local_28f0 + 8;
        local_15c8 = local_2a28;
        uStack_15c0 = uStack_2a20;
        *(undefined8 *)local_15b0 = local_2a28;
        *(undefined8 *)(local_28f0 + 10) = uStack_2a20;
        local_15d0 = local_28f0 + 0xc;
        local_15e8 = local_2a38;
        uStack_15e0 = uStack_2a30;
        *(undefined8 *)local_15d0 = local_2a38;
        *(undefined8 *)(local_28f0 + 0xe) = uStack_2a30;
        local_15f0 = local_28f0 + 0x10;
        local_1608 = local_2a48;
        uStack_1600 = uStack_2a40;
        *(undefined8 *)local_15f0 = local_2a48;
        *(undefined8 *)(local_28f0 + 0x12) = uStack_2a40;
        local_1610 = local_28f0 + 0x14;
        local_1628 = local_2a58;
        uStack_1620 = uStack_2a50;
        *(undefined8 *)local_1610 = local_2a58;
        *(undefined8 *)(local_28f0 + 0x16) = uStack_2a50;
        local_1630 = local_28f0 + 0x18;
        local_1648 = local_2a68;
        uStack_1640 = uStack_2a60;
        *(undefined8 *)local_1630 = local_2a68;
        *(undefined8 *)(local_28f0 + 0x1a) = uStack_2a60;
        local_1650 = local_28f0 + 0x1c;
        local_1668 = local_2a78;
        uStack_1660 = uStack_2a70;
        *(undefined8 *)local_1650 = local_2a78;
        *(undefined8 *)(local_28f0 + 0x1e) = uStack_2a70;
        local_1670 = local_28f0 + 0x20;
        local_1688 = local_2a88;
        uStack_1680 = uStack_2a80;
        *(undefined8 *)local_1670 = local_2a88;
        *(undefined8 *)(local_28f0 + 0x22) = uStack_2a80;
        local_1690 = local_28f0 + 0x24;
        local_16a8 = local_2a98;
        uStack_16a0 = uStack_2a90;
        *(undefined8 *)local_1690 = local_2a98;
        *(undefined8 *)(local_28f0 + 0x26) = uStack_2a90;
        local_16b0 = local_28f0 + 0x28;
        local_16c8 = local_2aa8;
        uStack_16c0 = uStack_2aa0;
        *(undefined8 *)local_16b0 = local_2aa8;
        *(undefined8 *)(local_28f0 + 0x2a) = uStack_2aa0;
        local_16d0 = local_28f0 + 0x2c;
        local_16e8 = local_2ab8;
        uStack_16e0 = uStack_2ab0;
        *local_16d0 = (float)local_838;
        local_28f0[0x2d] = local_838._4_4_;
        local_28f0[0x2e] = (float)uStack_830;
        local_28f0[0x2f] = uStack_830._4_4_;
        local_28f0 = local_28f0 + 0x30;
        local_838 = uVar4;
        uStack_830 = uVar5;
      }
      for (; local_29d4 + 7 < local_23fc; local_29d4 = local_29d4 + 8) {
        local_2164 = local_29d4 / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_29d4 % 0xc & 0xffffffffU) / 8);
        local_2160 = &local_29d0;
        local_2ba0 = (float *)((long)local_60 + (long)local_2424 * (long)local_2164 * local_2440);
        local_2174 = local_2984;
        local_2170 = &local_2980;
        local_2ba8 = (undefined8 *)(local_108 + (long)local_f4 * (long)local_2984 * local_110);
        local_1f8 = 0;
        uStack_1f0 = 0;
        local_2bc8 = 0;
        uStack_2bc0 = 0;
        local_208 = 0;
        uStack_200 = 0;
        local_2bd8 = 0;
        uStack_2bd0 = 0;
        local_218 = 0;
        uStack_210 = 0;
        local_2be8 = 0;
        uStack_2be0 = 0;
        local_228 = 0;
        uStack_220 = 0;
        local_2bf8 = 0;
        uStack_2bf0 = 0;
        local_238 = 0;
        uStack_230 = 0;
        local_2c08 = 0;
        uStack_2c00 = 0;
        local_248 = 0;
        uStack_240 = 0;
        local_2c18 = 0;
        uStack_2c10 = 0;
        local_258 = 0;
        uStack_250 = 0;
        local_2c28 = 0;
        uStack_2c20 = 0;
        local_268 = 0;
        uStack_260 = 0;
        local_2c38 = 0;
        uStack_2c30 = 0;
        local_2c3c = 0;
        while( true ) {
          uVar5 = uStack_730;
          uVar4 = local_738;
          local_738._0_4_ = (float)local_2c38;
          local_738._4_4_ = (float)((ulong)local_2c38 >> 0x20);
          uStack_730._0_4_ = (float)uStack_2c30;
          uStack_730._4_4_ = (float)((ulong)uStack_2c30 >> 0x20);
          if (local_2404 << 2 <= local_2c3c) break;
          local_1ff0 = local_2ba8;
          local_d48 = *local_2ba8;
          uStack_d40 = local_2ba8[1];
          local_1030 = local_2ba0;
          local_1048 = *local_2ba0;
          local_be8 = CONCAT44(local_1048,local_1048);
          uStack_be0 = CONCAT44(local_1048,local_1048);
          local_1050 = local_2ba0 + 1;
          local_1068 = *local_1050;
          local_c18 = CONCAT44(local_1068,local_1068);
          uStack_c10 = CONCAT44(local_1068,local_1068);
          local_1070 = local_2ba0 + 2;
          local_1088 = *local_1070;
          local_c48 = CONCAT44(local_1088,local_1088);
          uStack_c40 = CONCAT44(local_1088,local_1088);
          local_1090 = local_2ba0 + 3;
          local_10a8 = *local_1090;
          local_c78 = CONCAT44(local_10a8,local_10a8);
          uStack_c70 = CONCAT44(local_10a8,local_10a8);
          local_10b0 = local_2ba0 + 4;
          local_10c8 = *local_10b0;
          local_ca8 = CONCAT44(local_10c8,local_10c8);
          uStack_ca0 = CONCAT44(local_10c8,local_10c8);
          local_10d0 = local_2ba0 + 5;
          local_10e8 = *local_10d0;
          local_cd8 = CONCAT44(local_10e8,local_10e8);
          uStack_cd0 = CONCAT44(local_10e8,local_10e8);
          local_10f0 = local_2ba0 + 6;
          local_1108 = *local_10f0;
          local_d08 = CONCAT44(local_1108,local_1108);
          uStack_d00 = CONCAT44(local_1108,local_1108);
          pfStack_1110 = local_2ba0 + 7;
          local_1128 = *pfStack_1110;
          local_d38 = CONCAT44(local_1128,local_1128);
          uStack_d30 = CONCAT44(local_1128,local_1128);
          local_c08 = local_2bc8;
          uStack_c00 = uStack_2bc0;
          local_4b8._0_4_ = (float)local_d48;
          local_4b8._4_4_ = (float)((ulong)local_d48 >> 0x20);
          uStack_4b0._0_4_ = (float)uStack_d40;
          uStack_4b0._4_4_ = (float)((ulong)uStack_d40 >> 0x20);
          local_808 = local_1048 * (float)local_4b8;
          fStack_804 = local_1048 * local_4b8._4_4_;
          fStack_800 = local_1048 * (float)uStack_4b0;
          fStack_7fc = local_1048 * uStack_4b0._4_4_;
          uVar4 = local_2bc8;
          uVar5 = uStack_2bc0;
          local_818._0_4_ = (float)local_2bc8;
          local_818._4_4_ = (float)((ulong)local_2bc8 >> 0x20);
          uStack_810._0_4_ = (float)uStack_2bc0;
          uStack_810._4_4_ = (float)((ulong)uStack_2bc0 >> 0x20);
          local_2bc8 = CONCAT44(fStack_804 + local_818._4_4_,local_808 + (float)local_818);
          uStack_2bc0 = CONCAT44(fStack_7fc + uStack_810._4_4_,fStack_800 + (float)uStack_810);
          local_c38 = local_2bd8;
          uStack_c30 = uStack_2bd0;
          local_7e8 = local_1068 * (float)local_4b8;
          fStack_7e4 = local_1068 * local_4b8._4_4_;
          fStack_7e0 = local_1068 * (float)uStack_4b0;
          fStack_7dc = local_1068 * uStack_4b0._4_4_;
          uVar6 = local_2bd8;
          uVar7 = uStack_2bd0;
          local_7f8._0_4_ = (float)local_2bd8;
          local_7f8._4_4_ = (float)((ulong)local_2bd8 >> 0x20);
          uStack_7f0._0_4_ = (float)uStack_2bd0;
          uStack_7f0._4_4_ = (float)((ulong)uStack_2bd0 >> 0x20);
          local_2bd8 = CONCAT44(fStack_7e4 + local_7f8._4_4_,local_7e8 + (float)local_7f8);
          uStack_2bd0 = CONCAT44(fStack_7dc + uStack_7f0._4_4_,fStack_7e0 + (float)uStack_7f0);
          local_c68 = local_2be8;
          uStack_c60 = uStack_2be0;
          local_7c8 = local_1088 * (float)local_4b8;
          fStack_7c4 = local_1088 * local_4b8._4_4_;
          fStack_7c0 = local_1088 * (float)uStack_4b0;
          fStack_7bc = local_1088 * uStack_4b0._4_4_;
          uVar8 = local_2be8;
          uVar9 = uStack_2be0;
          local_7d8._0_4_ = (float)local_2be8;
          local_7d8._4_4_ = (float)((ulong)local_2be8 >> 0x20);
          uStack_7d0._0_4_ = (float)uStack_2be0;
          uStack_7d0._4_4_ = (float)((ulong)uStack_2be0 >> 0x20);
          local_2be8 = CONCAT44(fStack_7c4 + local_7d8._4_4_,local_7c8 + (float)local_7d8);
          uStack_2be0 = CONCAT44(fStack_7bc + uStack_7d0._4_4_,fStack_7c0 + (float)uStack_7d0);
          local_c98 = local_2bf8;
          uStack_c90 = uStack_2bf0;
          local_7a8 = local_10a8 * (float)local_4b8;
          fStack_7a4 = local_10a8 * local_4b8._4_4_;
          fStack_7a0 = local_10a8 * (float)uStack_4b0;
          fStack_79c = local_10a8 * uStack_4b0._4_4_;
          uVar10 = local_2bf8;
          uVar11 = uStack_2bf0;
          local_7b8._0_4_ = (float)local_2bf8;
          local_7b8._4_4_ = (float)((ulong)local_2bf8 >> 0x20);
          uStack_7b0._0_4_ = (float)uStack_2bf0;
          uStack_7b0._4_4_ = (float)((ulong)uStack_2bf0 >> 0x20);
          local_2bf8 = CONCAT44(fStack_7a4 + local_7b8._4_4_,local_7a8 + (float)local_7b8);
          uStack_2bf0 = CONCAT44(fStack_79c + uStack_7b0._4_4_,fStack_7a0 + (float)uStack_7b0);
          local_cc8 = local_2c08;
          uStack_cc0 = uStack_2c00;
          local_788 = local_10c8 * (float)local_4b8;
          fStack_784 = local_10c8 * local_4b8._4_4_;
          fStack_780 = local_10c8 * (float)uStack_4b0;
          fStack_77c = local_10c8 * uStack_4b0._4_4_;
          uVar12 = local_2c08;
          uVar13 = uStack_2c00;
          local_798._0_4_ = (float)local_2c08;
          local_798._4_4_ = (float)((ulong)local_2c08 >> 0x20);
          uStack_790._0_4_ = (float)uStack_2c00;
          uStack_790._4_4_ = (float)((ulong)uStack_2c00 >> 0x20);
          local_2c08 = CONCAT44(fStack_784 + local_798._4_4_,local_788 + (float)local_798);
          uStack_2c00 = CONCAT44(fStack_77c + uStack_790._4_4_,fStack_780 + (float)uStack_790);
          local_cf8 = local_2c18;
          uStack_cf0 = uStack_2c10;
          local_768 = local_10e8 * (float)local_4b8;
          fStack_764 = local_10e8 * local_4b8._4_4_;
          fStack_760 = local_10e8 * (float)uStack_4b0;
          fStack_75c = local_10e8 * uStack_4b0._4_4_;
          uVar14 = local_2c18;
          uVar15 = uStack_2c10;
          local_778._0_4_ = (float)local_2c18;
          local_778._4_4_ = (float)((ulong)local_2c18 >> 0x20);
          uStack_770._0_4_ = (float)uStack_2c10;
          uStack_770._4_4_ = (float)((ulong)uStack_2c10 >> 0x20);
          local_2c18 = CONCAT44(fStack_764 + local_778._4_4_,local_768 + (float)local_778);
          uStack_2c10 = CONCAT44(fStack_75c + uStack_770._4_4_,fStack_760 + (float)uStack_770);
          local_d28 = local_2c28;
          uStack_d20 = uStack_2c20;
          local_748 = local_1108 * (float)local_4b8;
          fStack_744 = local_1108 * local_4b8._4_4_;
          fStack_740 = local_1108 * (float)uStack_4b0;
          fStack_73c = local_1108 * uStack_4b0._4_4_;
          uVar16 = local_2c28;
          uVar17 = uStack_2c20;
          local_758._0_4_ = (float)local_2c28;
          local_758._4_4_ = (float)((ulong)local_2c28 >> 0x20);
          uStack_750._0_4_ = (float)uStack_2c20;
          uStack_750._4_4_ = (float)((ulong)uStack_2c20 >> 0x20);
          local_2c28 = CONCAT44(fStack_744 + local_758._4_4_,local_748 + (float)local_758);
          uStack_2c20 = CONCAT44(fStack_73c + uStack_750._4_4_,fStack_740 + (float)uStack_750);
          local_d58 = local_2c38;
          uStack_d50 = uStack_2c30;
          local_728 = local_1128 * (float)local_4b8;
          fStack_724 = local_1128 * local_4b8._4_4_;
          fStack_720 = local_1128 * (float)uStack_4b0;
          fStack_71c = local_1128 * uStack_4b0._4_4_;
          uVar18 = local_2c38;
          uVar19 = uStack_2c30;
          local_2c38 = CONCAT44(fStack_724 + local_738._4_4_,local_728 + (float)local_738);
          uStack_2c30 = CONCAT44(fStack_71c + uStack_730._4_4_,fStack_720 + (float)uStack_730);
          local_2ba0 = local_2ba0 + 8;
          local_2ba8 = local_2ba8 + 2;
          local_2c3c = local_2c3c + 1;
          fStack_1124 = local_1128;
          fStack_1120 = local_1128;
          fStack_111c = local_1128;
          local_1118 = local_1128;
          fStack_1104 = local_1108;
          fStack_1100 = local_1108;
          fStack_10fc = local_1108;
          local_10f4 = local_1108;
          fStack_10e4 = local_10e8;
          fStack_10e0 = local_10e8;
          fStack_10dc = local_10e8;
          local_10d4 = local_10e8;
          fStack_10c4 = local_10c8;
          fStack_10c0 = local_10c8;
          fStack_10bc = local_10c8;
          local_10b4 = local_10c8;
          fStack_10a4 = local_10a8;
          fStack_10a0 = local_10a8;
          fStack_109c = local_10a8;
          local_1094 = local_10a8;
          fStack_1084 = local_1088;
          fStack_1080 = local_1088;
          fStack_107c = local_1088;
          local_1074 = local_1088;
          fStack_1064 = local_1068;
          fStack_1060 = local_1068;
          fStack_105c = local_1068;
          local_1054 = local_1068;
          fStack_1044 = local_1048;
          fStack_1040 = local_1048;
          fStack_103c = local_1048;
          local_1034 = local_1048;
          local_d18 = local_d48;
          uStack_d10 = uStack_d40;
          local_ce8 = local_d48;
          uStack_ce0 = uStack_d40;
          local_cb8 = local_d48;
          uStack_cb0 = uStack_d40;
          local_c88 = local_d48;
          uStack_c80 = uStack_d40;
          local_c58 = local_d48;
          uStack_c50 = uStack_d40;
          local_c28 = local_d48;
          uStack_c20 = uStack_d40;
          local_bf8 = local_d48;
          uStack_bf0 = uStack_d40;
          local_818 = uVar4;
          uStack_810 = uVar5;
          local_7f8 = uVar6;
          uStack_7f0 = uVar7;
          local_7d8 = uVar8;
          uStack_7d0 = uVar9;
          local_7b8 = uVar10;
          uStack_7b0 = uVar11;
          local_798 = uVar12;
          uStack_790 = uVar13;
          local_778 = uVar14;
          uStack_770 = uVar15;
          local_758 = uVar16;
          uStack_750 = uVar17;
          local_738 = uVar18;
          uStack_730 = uVar19;
          local_4b8 = local_d48;
          uStack_4b0 = uStack_d40;
          local_4a8 = local_be8;
          uStack_4a0 = uStack_be0;
          local_498 = local_d48;
          uStack_490 = uStack_d40;
          local_488 = local_c18;
          uStack_480 = uStack_c10;
          local_478 = local_d48;
          uStack_470 = uStack_d40;
          local_468 = local_c48;
          uStack_460 = uStack_c40;
          local_458 = local_d48;
          uStack_450 = uStack_d40;
          local_448 = local_c78;
          uStack_440 = uStack_c70;
          local_438 = local_d48;
          uStack_430 = uStack_d40;
          local_428 = local_ca8;
          uStack_420 = uStack_ca0;
          local_418 = local_d48;
          uStack_410 = uStack_d40;
          local_408 = local_cd8;
          uStack_400 = uStack_cd0;
          local_3f8 = local_d48;
          uStack_3f0 = uStack_d40;
          local_3e8 = local_d08;
          uStack_3e0 = uStack_d00;
          local_3d8 = local_d48;
          uStack_3d0 = uStack_d40;
          local_3c8 = local_d38;
          uStack_3c0 = uStack_d30;
        }
        local_16f0 = local_28f0;
        local_1708 = local_2bc8;
        uStack_1700 = uStack_2bc0;
        *(undefined8 *)local_28f0 = local_2bc8;
        *(undefined8 *)(local_28f0 + 2) = uStack_2bc0;
        local_1710 = local_28f0 + 4;
        local_1728 = local_2bd8;
        uStack_1720 = uStack_2bd0;
        *(undefined8 *)local_1710 = local_2bd8;
        *(undefined8 *)(local_28f0 + 6) = uStack_2bd0;
        local_1730 = local_28f0 + 8;
        local_1748 = local_2be8;
        uStack_1740 = uStack_2be0;
        *(undefined8 *)local_1730 = local_2be8;
        *(undefined8 *)(local_28f0 + 10) = uStack_2be0;
        local_1750 = local_28f0 + 0xc;
        local_1768 = local_2bf8;
        uStack_1760 = uStack_2bf0;
        *(undefined8 *)local_1750 = local_2bf8;
        *(undefined8 *)(local_28f0 + 0xe) = uStack_2bf0;
        local_1770 = local_28f0 + 0x10;
        local_1788 = local_2c08;
        uStack_1780 = uStack_2c00;
        *(undefined8 *)local_1770 = local_2c08;
        *(undefined8 *)(local_28f0 + 0x12) = uStack_2c00;
        local_1790 = local_28f0 + 0x14;
        local_17a8 = local_2c18;
        uStack_17a0 = uStack_2c10;
        *(undefined8 *)local_1790 = local_2c18;
        *(undefined8 *)(local_28f0 + 0x16) = uStack_2c10;
        local_17b0 = local_28f0 + 0x18;
        local_17c8 = local_2c28;
        uStack_17c0 = uStack_2c20;
        *(undefined8 *)local_17b0 = local_2c28;
        *(undefined8 *)(local_28f0 + 0x1a) = uStack_2c20;
        local_17d0 = local_28f0 + 0x1c;
        local_17e8 = local_2c38;
        uStack_17e0 = uStack_2c30;
        *local_17d0 = (float)local_738;
        local_28f0[0x1d] = local_738._4_4_;
        local_28f0[0x1e] = (float)uStack_730;
        local_28f0[0x1f] = uStack_730._4_4_;
        local_28f0 = local_28f0 + 0x20;
        local_738 = uVar4;
        uStack_730 = uVar5;
      }
      for (; local_29d4 + 3 < local_23fc; local_29d4 = local_29d4 + 4) {
        uVar2 = (long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                      (long)local_29d4 % 0xc & 0xffffffffU) % 8;
        local_2184 = local_29d4 / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_29d4 % 0xc & 0xffffffffU) / 8) +
                     (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          4);
        local_2180 = &local_29d0;
        local_2ce0 = (float *)((long)local_60 + (long)local_2424 * (long)local_2184 * local_2440);
        local_2194 = local_2984;
        local_2190 = &local_2980;
        local_2ce8 = (undefined8 *)(local_108 + (long)local_f4 * (long)local_2984 * local_110);
        local_278 = 0;
        uStack_270 = 0;
        local_2d08 = 0;
        uStack_2d00 = 0;
        local_288 = 0;
        uStack_280 = 0;
        local_2d18 = 0;
        uStack_2d10 = 0;
        local_298 = 0;
        uStack_290 = 0;
        local_2d28 = 0;
        uStack_2d20 = 0;
        local_2a8 = 0;
        uStack_2a0 = 0;
        local_2d38 = 0;
        uStack_2d30 = 0;
        local_2d3c = 0;
        while( true ) {
          uVar5 = uStack_6b0;
          uVar4 = local_6b8;
          local_6b8._0_4_ = (float)local_2d38;
          local_6b8._4_4_ = (float)((ulong)local_2d38 >> 0x20);
          uStack_6b0._0_4_ = (float)uStack_2d30;
          uStack_6b0._4_4_ = (float)((ulong)uStack_2d30 >> 0x20);
          if (local_2404 << 2 <= local_2d3c) break;
          local_1ff8 = local_2ce8;
          local_e08 = *local_2ce8;
          uStack_e00 = local_2ce8[1];
          local_1130 = local_2ce0;
          local_1148 = *local_2ce0;
          local_d68 = CONCAT44(local_1148,local_1148);
          uStack_d60 = CONCAT44(local_1148,local_1148);
          local_1150 = local_2ce0 + 1;
          local_1168 = *local_1150;
          local_d98 = CONCAT44(local_1168,local_1168);
          uStack_d90 = CONCAT44(local_1168,local_1168);
          local_1170 = local_2ce0 + 2;
          local_1188 = *local_1170;
          local_dc8 = CONCAT44(local_1188,local_1188);
          uStack_dc0 = CONCAT44(local_1188,local_1188);
          pfStack_1190 = local_2ce0 + 3;
          local_11a8 = *pfStack_1190;
          local_df8 = CONCAT44(local_11a8,local_11a8);
          uStack_df0 = CONCAT44(local_11a8,local_11a8);
          local_d88 = local_2d08;
          uStack_d80 = uStack_2d00;
          local_3b8._0_4_ = (float)local_e08;
          local_3b8._4_4_ = (float)((ulong)local_e08 >> 0x20);
          uStack_3b0._0_4_ = (float)uStack_e00;
          uStack_3b0._4_4_ = (float)((ulong)uStack_e00 >> 0x20);
          local_708 = local_1148 * (float)local_3b8;
          fStack_704 = local_1148 * local_3b8._4_4_;
          fStack_700 = local_1148 * (float)uStack_3b0;
          fStack_6fc = local_1148 * uStack_3b0._4_4_;
          uVar4 = local_2d08;
          uVar5 = uStack_2d00;
          local_718._0_4_ = (float)local_2d08;
          local_718._4_4_ = (float)((ulong)local_2d08 >> 0x20);
          uStack_710._0_4_ = (float)uStack_2d00;
          uStack_710._4_4_ = (float)((ulong)uStack_2d00 >> 0x20);
          local_2d08 = CONCAT44(fStack_704 + local_718._4_4_,local_708 + (float)local_718);
          uStack_2d00 = CONCAT44(fStack_6fc + uStack_710._4_4_,fStack_700 + (float)uStack_710);
          local_db8 = local_2d18;
          uStack_db0 = uStack_2d10;
          local_6e8 = local_1168 * (float)local_3b8;
          fStack_6e4 = local_1168 * local_3b8._4_4_;
          fStack_6e0 = local_1168 * (float)uStack_3b0;
          fStack_6dc = local_1168 * uStack_3b0._4_4_;
          uVar6 = local_2d18;
          uVar7 = uStack_2d10;
          local_6f8._0_4_ = (float)local_2d18;
          local_6f8._4_4_ = (float)((ulong)local_2d18 >> 0x20);
          uStack_6f0._0_4_ = (float)uStack_2d10;
          uStack_6f0._4_4_ = (float)((ulong)uStack_2d10 >> 0x20);
          local_2d18 = CONCAT44(fStack_6e4 + local_6f8._4_4_,local_6e8 + (float)local_6f8);
          uStack_2d10 = CONCAT44(fStack_6dc + uStack_6f0._4_4_,fStack_6e0 + (float)uStack_6f0);
          local_de8 = local_2d28;
          uStack_de0 = uStack_2d20;
          local_6c8 = local_1188 * (float)local_3b8;
          fStack_6c4 = local_1188 * local_3b8._4_4_;
          fStack_6c0 = local_1188 * (float)uStack_3b0;
          fStack_6bc = local_1188 * uStack_3b0._4_4_;
          uVar8 = local_2d28;
          uVar9 = uStack_2d20;
          local_6d8._0_4_ = (float)local_2d28;
          local_6d8._4_4_ = (float)((ulong)local_2d28 >> 0x20);
          uStack_6d0._0_4_ = (float)uStack_2d20;
          uStack_6d0._4_4_ = (float)((ulong)uStack_2d20 >> 0x20);
          local_2d28 = CONCAT44(fStack_6c4 + local_6d8._4_4_,local_6c8 + (float)local_6d8);
          uStack_2d20 = CONCAT44(fStack_6bc + uStack_6d0._4_4_,fStack_6c0 + (float)uStack_6d0);
          local_e18 = local_2d38;
          uStack_e10 = uStack_2d30;
          local_6a8 = local_11a8 * (float)local_3b8;
          fStack_6a4 = local_11a8 * local_3b8._4_4_;
          fStack_6a0 = local_11a8 * (float)uStack_3b0;
          fStack_69c = local_11a8 * uStack_3b0._4_4_;
          uVar10 = local_2d38;
          uVar11 = uStack_2d30;
          local_2d38 = CONCAT44(fStack_6a4 + local_6b8._4_4_,local_6a8 + (float)local_6b8);
          uStack_2d30 = CONCAT44(fStack_69c + uStack_6b0._4_4_,fStack_6a0 + (float)uStack_6b0);
          local_2ce0 = local_2ce0 + 4;
          local_2ce8 = local_2ce8 + 2;
          local_2d3c = local_2d3c + 1;
          fStack_11a4 = local_11a8;
          fStack_11a0 = local_11a8;
          fStack_119c = local_11a8;
          local_1198 = local_11a8;
          fStack_1184 = local_1188;
          fStack_1180 = local_1188;
          fStack_117c = local_1188;
          local_1174 = local_1188;
          fStack_1164 = local_1168;
          fStack_1160 = local_1168;
          fStack_115c = local_1168;
          local_1154 = local_1168;
          fStack_1144 = local_1148;
          fStack_1140 = local_1148;
          fStack_113c = local_1148;
          local_1134 = local_1148;
          local_dd8 = local_e08;
          uStack_dd0 = uStack_e00;
          local_da8 = local_e08;
          uStack_da0 = uStack_e00;
          local_d78 = local_e08;
          uStack_d70 = uStack_e00;
          local_718 = uVar4;
          uStack_710 = uVar5;
          local_6f8 = uVar6;
          uStack_6f0 = uVar7;
          local_6d8 = uVar8;
          uStack_6d0 = uVar9;
          local_6b8 = uVar10;
          uStack_6b0 = uVar11;
          local_3b8 = local_e08;
          uStack_3b0 = uStack_e00;
          local_3a8 = local_d68;
          uStack_3a0 = uStack_d60;
          local_398 = local_e08;
          uStack_390 = uStack_e00;
          local_388 = local_d98;
          uStack_380 = uStack_d90;
          local_378 = local_e08;
          uStack_370 = uStack_e00;
          local_368 = local_dc8;
          uStack_360 = uStack_dc0;
          local_358 = local_e08;
          uStack_350 = uStack_e00;
          local_348 = local_df8;
          uStack_340 = uStack_df0;
        }
        local_17f0 = local_28f0;
        local_1808 = local_2d08;
        uStack_1800 = uStack_2d00;
        *(undefined8 *)local_28f0 = local_2d08;
        *(undefined8 *)(local_28f0 + 2) = uStack_2d00;
        local_1810 = local_28f0 + 4;
        local_1828 = local_2d18;
        uStack_1820 = uStack_2d10;
        *(undefined8 *)local_1810 = local_2d18;
        *(undefined8 *)(local_28f0 + 6) = uStack_2d10;
        local_1830 = local_28f0 + 8;
        local_1848 = local_2d28;
        uStack_1840 = uStack_2d20;
        *(undefined8 *)local_1830 = local_2d28;
        *(undefined8 *)(local_28f0 + 10) = uStack_2d20;
        local_1850 = local_28f0 + 0xc;
        local_1868 = local_2d38;
        uStack_1860 = uStack_2d30;
        *local_1850 = (float)local_6b8;
        local_28f0[0xd] = local_6b8._4_4_;
        local_28f0[0xe] = (float)uStack_6b0;
        local_28f0[0xf] = uStack_6b0._4_4_;
        local_28f0 = local_28f0 + 0x10;
        local_6b8 = uVar4;
        uStack_6b0 = uVar5;
      }
      for (; local_29d4 + 1 < local_23fc; local_29d4 = local_29d4 + 2) {
        uVar2 = (long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                      (long)local_29d4 % 0xc & 0xffffffffU) % 8;
        uVar3 = (long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                      (long)local_29d4 % 0xc & 0xffffffffU) % 4;
        local_21a4 = local_29d4 / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_29d4 % 0xc & 0xffffffffU) / 8) +
                     (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          4) + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                           uVar3 & 0xffffffff) / 2);
        local_21a0 = &local_29d0;
        local_2da0 = (float *)((long)local_60 + (long)local_2424 * (long)local_21a4 * local_2440);
        local_21b4 = local_2984;
        local_21b0 = &local_2980;
        local_2da8 = (undefined8 *)(local_108 + (long)local_f4 * (long)local_2984 * local_110);
        local_2b8 = 0;
        uStack_2b0 = 0;
        local_2dc8 = 0;
        uStack_2dc0 = 0;
        local_2c8 = 0;
        uStack_2c0 = 0;
        local_2dd8 = 0;
        uStack_2dd0 = 0;
        local_2ddc = 0;
        while( true ) {
          uVar5 = uStack_670;
          uVar4 = local_678;
          local_678._0_4_ = (float)local_2dd8;
          local_678._4_4_ = (float)((ulong)local_2dd8 >> 0x20);
          uStack_670._0_4_ = (float)uStack_2dd0;
          uStack_670._4_4_ = (float)((ulong)uStack_2dd0 >> 0x20);
          if (local_2404 << 2 <= local_2ddc) break;
          local_2000 = local_2da8;
          local_e68 = *local_2da8;
          uStack_e60 = local_2da8[1];
          local_11b0 = local_2da0;
          local_11c8 = *local_2da0;
          local_e28 = CONCAT44(local_11c8,local_11c8);
          uStack_e20 = CONCAT44(local_11c8,local_11c8);
          pfStack_11d0 = local_2da0 + 1;
          local_11e8 = *pfStack_11d0;
          local_e58 = CONCAT44(local_11e8,local_11e8);
          uStack_e50 = CONCAT44(local_11e8,local_11e8);
          local_e48 = local_2dc8;
          uStack_e40 = uStack_2dc0;
          local_338._0_4_ = (float)local_e68;
          local_338._4_4_ = (float)((ulong)local_e68 >> 0x20);
          uStack_330._0_4_ = (float)uStack_e60;
          uStack_330._4_4_ = (float)((ulong)uStack_e60 >> 0x20);
          local_688 = local_11c8 * (float)local_338;
          fStack_684 = local_11c8 * local_338._4_4_;
          fStack_680 = local_11c8 * (float)uStack_330;
          fStack_67c = local_11c8 * uStack_330._4_4_;
          uVar4 = local_2dc8;
          uVar5 = uStack_2dc0;
          local_698._0_4_ = (float)local_2dc8;
          local_698._4_4_ = (float)((ulong)local_2dc8 >> 0x20);
          uStack_690._0_4_ = (float)uStack_2dc0;
          uStack_690._4_4_ = (float)((ulong)uStack_2dc0 >> 0x20);
          local_2dc8 = CONCAT44(fStack_684 + local_698._4_4_,local_688 + (float)local_698);
          uStack_2dc0 = CONCAT44(fStack_67c + uStack_690._4_4_,fStack_680 + (float)uStack_690);
          local_e78 = local_2dd8;
          uStack_e70 = uStack_2dd0;
          local_668 = local_11e8 * (float)local_338;
          fStack_664 = local_11e8 * local_338._4_4_;
          fStack_660 = local_11e8 * (float)uStack_330;
          fStack_65c = local_11e8 * uStack_330._4_4_;
          uVar6 = local_2dd8;
          uVar7 = uStack_2dd0;
          local_2dd8 = CONCAT44(fStack_664 + local_678._4_4_,local_668 + (float)local_678);
          uStack_2dd0 = CONCAT44(fStack_65c + uStack_670._4_4_,fStack_660 + (float)uStack_670);
          local_2da0 = local_2da0 + 2;
          local_2da8 = local_2da8 + 2;
          local_2ddc = local_2ddc + 1;
          fStack_11e4 = local_11e8;
          fStack_11e0 = local_11e8;
          fStack_11dc = local_11e8;
          local_11d8 = local_11e8;
          fStack_11c4 = local_11c8;
          fStack_11c0 = local_11c8;
          fStack_11bc = local_11c8;
          local_11b4 = local_11c8;
          local_e38 = local_e68;
          uStack_e30 = uStack_e60;
          local_698 = uVar4;
          uStack_690 = uVar5;
          local_678 = uVar6;
          uStack_670 = uVar7;
          local_338 = local_e68;
          uStack_330 = uStack_e60;
          local_328 = local_e28;
          uStack_320 = uStack_e20;
          local_318 = local_e68;
          uStack_310 = uStack_e60;
          local_308 = local_e58;
          uStack_300 = uStack_e50;
        }
        local_1870 = local_28f0;
        local_1888 = local_2dc8;
        uStack_1880 = uStack_2dc0;
        *(undefined8 *)local_28f0 = local_2dc8;
        *(undefined8 *)(local_28f0 + 2) = uStack_2dc0;
        local_1890 = local_28f0 + 4;
        local_18a8 = local_2dd8;
        uStack_18a0 = uStack_2dd0;
        *local_1890 = (float)local_678;
        local_28f0[5] = local_678._4_4_;
        local_28f0[6] = (float)uStack_670;
        local_28f0[7] = uStack_670._4_4_;
        local_28f0 = local_28f0 + 8;
        local_678 = uVar4;
        uStack_670 = uVar5;
      }
      for (; local_29d4 < local_23fc; local_29d4 = local_29d4 + 1) {
        uVar2 = (long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                      (long)local_29d4 % 0xc & 0xffffffffU) % 8;
        uVar3 = (long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                      (long)local_29d4 % 0xc & 0xffffffffU) % 4;
        local_21c4 = local_29d4 / 0xc +
                     (int)((long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_29d4 % 0xc & 0xffffffffU) / 8) +
                     (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          4) + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                           uVar3 & 0xffffffff) / 2) +
                     (int)((long)((ulong)(uint)((int)((long)local_29d4 % 0xc) >> 0x1f) << 0x20 |
                                 (long)local_29d4 % 0xc & 0xffffffffU) % 2);
        local_21c0 = &local_29d0;
        local_2e20 = (float *)((long)local_60 + (long)local_2424 * (long)local_21c4 * local_2440);
        local_21d4 = local_2984;
        local_21d0 = &local_2980;
        local_2e28 = (undefined8 *)(local_108 + (long)local_f4 * (long)local_2984 * local_110);
        local_2d8 = 0;
        uStack_2d0 = 0;
        local_2e48 = 0;
        uStack_2e40 = 0;
        local_2e4c = 0;
        while( true ) {
          uVar5 = uStack_650;
          uVar4 = local_658;
          local_658._0_4_ = (float)local_2e48;
          local_658._4_4_ = (float)((ulong)local_2e48 >> 0x20);
          uStack_650._0_4_ = (float)uStack_2e40;
          uStack_650._4_4_ = (float)((ulong)uStack_2e40 >> 0x20);
          if (local_2404 << 2 <= local_2e4c) break;
          local_2008 = local_2e28;
          local_e98 = *local_2e28;
          uStack_e90 = local_2e28[1];
          pfStack_11f0 = local_2e20;
          local_1208 = *local_2e20;
          local_e88 = CONCAT44(local_1208,local_1208);
          uStack_e80 = CONCAT44(local_1208,local_1208);
          local_ea8 = local_2e48;
          uStack_ea0 = uStack_2e40;
          local_2f8._0_4_ = (float)local_e98;
          local_2f8._4_4_ = (float)((ulong)local_e98 >> 0x20);
          uStack_2f0._0_4_ = (float)uStack_e90;
          uStack_2f0._4_4_ = (float)((ulong)uStack_e90 >> 0x20);
          local_648 = local_1208 * (float)local_2f8;
          fStack_644 = local_1208 * local_2f8._4_4_;
          fStack_640 = local_1208 * (float)uStack_2f0;
          fStack_63c = local_1208 * uStack_2f0._4_4_;
          uVar4 = local_2e48;
          uVar5 = uStack_2e40;
          local_2e48 = CONCAT44(fStack_644 + local_658._4_4_,local_648 + (float)local_658);
          uStack_2e40 = CONCAT44(fStack_63c + uStack_650._4_4_,fStack_640 + (float)uStack_650);
          local_2e20 = local_2e20 + 1;
          local_2e28 = local_2e28 + 2;
          local_2e4c = local_2e4c + 1;
          fStack_1204 = local_1208;
          fStack_1200 = local_1208;
          fStack_11fc = local_1208;
          local_11f8 = local_1208;
          local_658 = uVar4;
          uStack_650 = uVar5;
          local_2f8 = local_e98;
          uStack_2f0 = uStack_e90;
          local_2e8 = local_e88;
          uStack_2e0 = uStack_e80;
        }
        local_18b0 = local_28f0;
        local_18c8 = local_2e48;
        uStack_18c0 = uStack_2e40;
        *local_28f0 = (float)local_658;
        local_28f0[1] = local_658._4_4_;
        local_28f0[2] = (float)uStack_650;
        local_28f0[3] = uStack_650._4_4_;
        local_28f0 = local_28f0 + 4;
        local_658 = uVar4;
        uStack_650 = uVar5;
      }
      local_2390 = &local_29d0;
      local_29b0 = local_2430;
      local_3c = 0x10;
      local_4c = local_2424;
      local_50 = local_2420;
      local_54 = local_241c;
      local_68 = local_2440;
      local_6c = local_2438;
      local_78 = local_2430;
      local_226c = local_2984;
      local_226d = 1;
      local_29d0 = 0;
      local_29c0 = 0;
      local_29b8 = 0;
      local_29a8 = 0;
      local_29a4 = 0;
      local_29a0 = 0;
      local_299c = 0;
      local_2998 = 0;
      local_2990 = 0;
      local_29c8 = 0;
      local_22d8 = local_2390;
    }
    local_2380 = &local_2980;
    local_2900 = 0;
    local_2904 = 0;
    local_2908 = 0;
    local_290c = 0;
    local_2920 = 0;
    local_2928 = 0;
    local_2930 = 0;
    local_2938 = 0;
    local_2134 = local_28e4;
    local_2135 = 1;
    local_223c = local_28e4;
    local_223d = 1;
    local_28f8 = 0;
    local_2910 = 0;
    local_2980 = 0;
    local_2970 = 0;
    local_2968 = 0;
    local_2958 = 0;
    local_2954 = 0;
    local_2950 = 0;
    local_294c = 0;
    local_2948 = 0;
    local_2940 = 0;
    local_2978 = 0;
    local_22f8 = local_2380;
    local_22b8 = local_23a0;
    local_2960 = local_120;
    local_2918 = local_b0;
  }
  local_2370 = &local_2450;
  if (local_2448 != (int *)0x0) {
    local_231c = 0xffffffff;
    LOCK();
    local_2320 = *local_2448;
    *local_2448 = *local_2448 + -1;
    UNLOCK();
    if (local_2320 == 1) {
      local_2318 = local_2370;
      if (local_2430 == (long *)0x0) {
        local_2070 = local_2450;
        if (local_2450 != (void *)0x0) {
          free(local_2450);
        }
      }
      else {
        (**(code **)(*local_2430 + 0x18))(local_2430,local_2450);
      }
    }
  }
  return;
}

Assistant:

static void convolution_winograd_dot_pack4_sse(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 16u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;
        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x12
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(r0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(r0 + 4 * 9);
                __m128 _ra = _mm_load_ps(r0 + 4 * 10);
                __m128 _rb = _mm_load_ps(r0 + 4 * 11);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r8);
                _mm_store_ps(tmpptr + 4 * 3, _r1);
                _mm_store_ps(tmpptr + 4 * 4, _r5);
                _mm_store_ps(tmpptr + 4 * 5, _r9);
                _mm_store_ps(tmpptr + 4 * 6, _r2);
                _mm_store_ps(tmpptr + 4 * 7, _r6);
                _mm_store_ps(tmpptr + 4 * 8, _ra);
                _mm_store_ps(tmpptr + 4 * 9, _r3);
                _mm_store_ps(tmpptr + 4 * 10, _r7);
                _mm_store_ps(tmpptr + 4 * 11, _rb);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 48;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x8
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r1);
                _mm_store_ps(tmpptr + 4 * 3, _r5);
                _mm_store_ps(tmpptr + 4 * 4, _r2);
                _mm_store_ps(tmpptr + 4 * 5, _r6);
                _mm_store_ps(tmpptr + 4 * 6, _r3);
                _mm_store_ps(tmpptr + 4 * 7, _r7);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 32;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x4
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r1);
                _mm_store_ps(tmpptr + 4 * 2, _r2);
                _mm_store_ps(tmpptr + 4 * 3, _r3);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 16;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x2
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);

                __m128 _r01_0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _r01_1 = _mm_unpackhi_ps(_r0, _r1);

                _mm_store_ps(tmpptr, _r01_0);
                _mm_store_ps(tmpptr + 4, _r01_1);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 8;
            }
        }
        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                __m128 _val = _mm_load_ps(r0);
                _mm_store_ps(tmpptr, _val);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 4;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();
                __m128 _sum8 = _mm_setzero_ps();
                __m128 _sum9 = _mm_setzero_ps();
                __m128 _suma = _mm_setzero_ps();
                __m128 _sumb = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);
                    __m128 _val8 = _mm_load1_ps(r0 + 8);
                    __m128 _val9 = _mm_load1_ps(r0 + 9);
                    __m128 _vala = _mm_load1_ps(r0 + 10);
                    __m128 _valb = _mm_load1_ps(r0 + 11);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);
                    _sum8 = _mm_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm_comp_fmadd_ps(_val9, _w0, _sum9);
                    _suma = _mm_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);
                _mm_store_ps(output0_tm + 4 * 8, _sum8);
                _mm_store_ps(output0_tm + 4 * 9, _sum9);
                _mm_store_ps(output0_tm + 4 * 10, _suma);
                _mm_store_ps(output0_tm + 4 * 11, _sumb);

                output0_tm += 4 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);

                output0_tm += 4 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);

                output0_tm += 4 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);

                output0_tm += 4 * 2;
            }
            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);
                    __m128 _val0 = _mm_load1_ps(r0);
                    _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                    r0 += 1;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum);

                output0_tm += 4;
            }
        }
    }
}